

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock_sse.c
# Opt level: O0

void uavs3d_deblock_hor_luma_sse(pel *src,int stride,int alpha,int beta,int flt_flag)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  int iVar91;
  undefined7 uVar92;
  undefined7 uVar93;
  undefined7 uVar94;
  undefined7 uVar95;
  undefined7 uVar96;
  undefined7 uVar97;
  longlong lVar98;
  longlong lVar99;
  longlong lVar100;
  longlong lVar101;
  longlong lVar102;
  longlong lVar103;
  longlong lVar104;
  short sVar105;
  ulong uVar106;
  short sVar111;
  short sVar112;
  short sVar114;
  short sVar117;
  short sVar118;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  ulong uVar107;
  short sVar113;
  ulong uVar115;
  ulong uVar116;
  short sVar119;
  undefined1 auVar110 [16];
  ulong uVar120;
  ulong uVar125;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  __m128i c_8;
  __m128i c_6;
  __m128i c_5;
  __m128i c_4;
  __m128i c_3;
  __m128i c_2;
  __m128i c_1;
  __m128i c_0;
  __m128i BETA;
  __m128i ALPHA;
  __m128i FS6;
  __m128i FS5;
  __m128i FS4;
  __m128i FS3;
  __m128i FS;
  __m128i FLT;
  __m128i FLT_R;
  __m128i FLT_L;
  __m128i M2;
  __m128i M1;
  __m128i M0;
  __m128i T7;
  __m128i T6;
  __m128i T5;
  __m128i T4;
  __m128i T3;
  __m128i T2;
  __m128i T1;
  __m128i T0;
  __m128i V3;
  __m128i V2;
  __m128i V1;
  __m128i V0;
  __m128i TR2w;
  __m128i TR1w;
  __m128i TR0w;
  __m128i TL2w;
  __m128i TL1w;
  __m128i TL0w;
  __m128i TR3;
  __m128i TR2;
  __m128i TR1;
  __m128i TR0;
  __m128i TL3;
  __m128i TL2;
  __m128i TL1;
  __m128i TL0;
  int flag1;
  int flag0;
  int inc4;
  int inc3;
  int inc2;
  int inc;
  int flt_flag_local;
  int beta_local;
  int alpha_local;
  int stride_local;
  pel *src_local;
  byte bStack_1a77;
  byte bStack_1a76;
  byte bStack_1a75;
  byte bStack_1a74;
  byte bStack_1a73;
  byte bStack_1a72;
  byte bStack_1a71;
  byte local_1a58;
  byte bStack_1a57;
  byte bStack_1a56;
  byte bStack_1a55;
  byte bStack_1a54;
  byte bStack_1a53;
  byte bStack_1a52;
  byte bStack_1a51;
  byte local_1a38;
  byte bStack_1a37;
  byte bStack_1a36;
  byte bStack_1a35;
  byte bStack_1a34;
  byte bStack_1a33;
  byte bStack_1a32;
  byte bStack_1a31;
  byte local_1a18;
  byte bStack_1a17;
  byte bStack_1a16;
  byte bStack_1a15;
  byte bStack_1a14;
  byte bStack_1a13;
  byte bStack_1a12;
  byte bStack_1a11;
  byte local_19f8;
  byte bStack_19f7;
  byte bStack_19f6;
  byte bStack_19f5;
  byte bStack_19f4;
  byte bStack_19f3;
  byte bStack_19f2;
  byte bStack_19f1;
  byte local_19d8;
  byte bStack_19d7;
  byte bStack_19d6;
  byte bStack_19d5;
  byte bStack_19d4;
  byte bStack_19d3;
  byte bStack_19d2;
  byte bStack_19d1;
  byte local_19b8;
  byte bStack_19b7;
  byte bStack_19b6;
  byte bStack_19b5;
  byte bStack_19b4;
  byte bStack_19b3;
  byte bStack_19b2;
  byte bStack_19b1;
  byte bStack_1997;
  byte bStack_1996;
  byte bStack_1995;
  byte bStack_1994;
  byte bStack_1993;
  byte bStack_1992;
  byte bStack_1991;
  short local_1788;
  short sStack_1786;
  short sStack_1784;
  short sStack_1782;
  short sStack_1780;
  short sStack_177e;
  short sStack_177c;
  short sStack_177a;
  short local_1748;
  short sStack_1746;
  short sStack_1744;
  short sStack_1742;
  short sStack_1740;
  short sStack_173e;
  short sStack_173c;
  short sStack_173a;
  short local_1728;
  short sStack_1726;
  short sStack_1724;
  short sStack_1722;
  short sStack_1720;
  short sStack_171e;
  short sStack_171c;
  short sStack_171a;
  short local_1708;
  short sStack_1706;
  short sStack_1704;
  short sStack_1702;
  short sStack_1700;
  short sStack_16fe;
  short sStack_16fc;
  short sStack_16fa;
  short local_16e8;
  short sStack_16e6;
  short sStack_16e4;
  short sStack_16e2;
  short sStack_16e0;
  short sStack_16de;
  short sStack_16dc;
  short sStack_16da;
  short local_16c8;
  short sStack_16c6;
  short sStack_16c4;
  short sStack_16c2;
  short sStack_16c0;
  short sStack_16be;
  short sStack_16bc;
  short sStack_16ba;
  short local_16a8;
  short sStack_16a6;
  short sStack_16a4;
  short sStack_16a2;
  short sStack_16a0;
  short sStack_169e;
  short sStack_169c;
  short sStack_169a;
  short local_1658;
  short sStack_1656;
  short sStack_1654;
  short sStack_1652;
  short sStack_1650;
  short sStack_164e;
  short sStack_164c;
  short sStack_164a;
  short local_1638;
  short sStack_1636;
  short sStack_1634;
  short sStack_1632;
  short sStack_1630;
  short sStack_162e;
  short sStack_162c;
  short sStack_162a;
  ushort uStack_1606;
  ushort uStack_1604;
  ushort uStack_1602;
  ushort uStack_15fe;
  ushort uStack_15fc;
  ushort uStack_15fa;
  ushort uStack_15e6;
  ushort uStack_15e4;
  ushort uStack_15e2;
  ushort uStack_15de;
  ushort uStack_15dc;
  ushort uStack_15da;
  short local_1578;
  short sStack_1576;
  short sStack_1574;
  short sStack_1572;
  short sStack_1570;
  short sStack_156e;
  short sStack_156c;
  short sStack_156a;
  short local_1558;
  short sStack_1556;
  short sStack_1554;
  short sStack_1552;
  short sStack_1550;
  short sStack_154e;
  short sStack_154c;
  short sStack_154a;
  short local_1408;
  short sStack_1406;
  short sStack_1404;
  short sStack_1402;
  short sStack_1400;
  short sStack_13fe;
  short sStack_13fc;
  short sStack_13fa;
  short local_13e8;
  short sStack_13e6;
  short sStack_13e4;
  short sStack_13e2;
  short sStack_13e0;
  short sStack_13de;
  short sStack_13dc;
  short sStack_13da;
  short local_13a8;
  short sStack_13a6;
  short sStack_13a4;
  short sStack_13a2;
  short sStack_13a0;
  short sStack_139e;
  short sStack_139c;
  short sStack_139a;
  short local_1378;
  short sStack_1376;
  short sStack_1374;
  short sStack_1372;
  short sStack_1370;
  short sStack_136e;
  short sStack_136c;
  short sStack_136a;
  short local_1358;
  short sStack_1356;
  short sStack_1354;
  short sStack_1352;
  short sStack_1350;
  short sStack_134e;
  short sStack_134c;
  short sStack_134a;
  short local_12b8;
  short sStack_12b6;
  short sStack_12b4;
  short sStack_12b2;
  short sStack_12b0;
  short sStack_12ae;
  short sStack_12ac;
  short sStack_12aa;
  short local_1298;
  short sStack_1296;
  short sStack_1294;
  short sStack_1292;
  short sStack_1290;
  short sStack_128e;
  short sStack_128c;
  short sStack_128a;
  short local_1278;
  short sStack_1276;
  short sStack_1274;
  short sStack_1272;
  short sStack_1270;
  short sStack_126e;
  short sStack_126c;
  short sStack_126a;
  short local_1258;
  short sStack_1256;
  short sStack_1254;
  short sStack_1252;
  short sStack_1250;
  short sStack_124e;
  short sStack_124c;
  short sStack_124a;
  short local_1248;
  short sStack_1246;
  short sStack_1244;
  short sStack_1242;
  short sStack_1240;
  short sStack_123e;
  short sStack_123c;
  short sStack_123a;
  short local_1228;
  short sStack_1226;
  short sStack_1224;
  short sStack_1222;
  short sStack_1220;
  short sStack_121e;
  short sStack_121c;
  short sStack_121a;
  short local_1168;
  short sStack_1166;
  short sStack_1164;
  short sStack_1162;
  short sStack_1160;
  short sStack_115e;
  short sStack_115c;
  short sStack_115a;
  short local_1138;
  short sStack_1136;
  short sStack_1134;
  short sStack_1132;
  short sStack_1130;
  short sStack_112e;
  short sStack_112c;
  short sStack_112a;
  short local_1118;
  short sStack_1116;
  short sStack_1114;
  short sStack_1112;
  short sStack_1110;
  short sStack_110e;
  short sStack_110c;
  short sStack_110a;
  ushort uStack_10f6;
  ushort uStack_10f4;
  ushort uStack_10f2;
  ushort uStack_10f0;
  ushort uStack_10ee;
  ushort uStack_10ec;
  ushort uStack_10ea;
  ushort uStack_10d6;
  ushort uStack_10d4;
  ushort uStack_10d2;
  ushort uStack_10d0;
  ushort uStack_10ce;
  ushort uStack_10cc;
  ushort uStack_10ca;
  short local_1078;
  short sStack_1076;
  short sStack_1074;
  short sStack_1072;
  short sStack_1070;
  short sStack_106e;
  short sStack_106c;
  short sStack_106a;
  short local_1058;
  short sStack_1056;
  short sStack_1054;
  short sStack_1052;
  short sStack_1050;
  short sStack_104e;
  short sStack_104c;
  short sStack_104a;
  short local_1048;
  short sStack_1046;
  short sStack_1044;
  short sStack_1042;
  short sStack_1040;
  short sStack_103e;
  short sStack_103c;
  short sStack_103a;
  short local_1028;
  short sStack_1026;
  short sStack_1024;
  short sStack_1022;
  short sStack_1020;
  short sStack_101e;
  short sStack_101c;
  short sStack_101a;
  short local_fe8;
  short sStack_fe6;
  short sStack_fe4;
  short sStack_fe2;
  short sStack_fe0;
  short sStack_fde;
  short sStack_fdc;
  short sStack_fda;
  short local_f78;
  short sStack_f76;
  short sStack_f74;
  short sStack_f72;
  short sStack_f70;
  short sStack_f6e;
  short sStack_f6c;
  short sStack_f6a;
  short local_f58;
  short sStack_f56;
  short sStack_f54;
  short sStack_f52;
  short sStack_f50;
  short sStack_f4e;
  short sStack_f4c;
  short sStack_f4a;
  short local_ee8;
  short sStack_ee6;
  short sStack_ee4;
  short sStack_ee2;
  short sStack_ee0;
  short sStack_ede;
  short sStack_edc;
  short sStack_eda;
  short local_ed8;
  short sStack_ed6;
  short sStack_ed4;
  short sStack_ed2;
  short sStack_ed0;
  short sStack_ece;
  short sStack_ecc;
  short sStack_eca;
  short local_ec8;
  short sStack_ec6;
  short sStack_ec4;
  short sStack_ec2;
  short sStack_ec0;
  short sStack_ebe;
  short sStack_ebc;
  short sStack_eba;
  short local_eb8;
  short sStack_eb6;
  short sStack_eb4;
  short sStack_eb2;
  short sStack_eb0;
  short sStack_eae;
  short sStack_eac;
  short sStack_eaa;
  short local_e18;
  short sStack_e16;
  short sStack_e14;
  short sStack_e12;
  short sStack_e10;
  short sStack_e0e;
  short sStack_e0c;
  short sStack_e0a;
  ushort uStack_d66;
  ushort uStack_d64;
  ushort uStack_d62;
  ushort uStack_d60;
  ushort uStack_d5e;
  ushort uStack_d5c;
  ushort uStack_d5a;
  ushort uStack_d56;
  ushort uStack_d54;
  ushort uStack_d52;
  ushort uStack_d50;
  ushort uStack_d4e;
  ushort uStack_d4c;
  ushort uStack_d4a;
  ushort uStack_d46;
  ushort uStack_d44;
  ushort uStack_d42;
  ushort uStack_d40;
  ushort uStack_d3e;
  ushort uStack_d3c;
  ushort uStack_d3a;
  ushort uStack_d36;
  ushort uStack_d34;
  ushort uStack_d32;
  ushort uStack_d30;
  ushort uStack_d2e;
  ushort uStack_d2c;
  ushort uStack_d2a;
  short local_3d8;
  short sStack_3d6;
  short sStack_3d4;
  short sStack_3d2;
  short sStack_3d0;
  short sStack_3ce;
  short sStack_3cc;
  short sStack_3ca;
  short local_3b8;
  short sStack_3b6;
  short sStack_3b4;
  short sStack_3b2;
  short sStack_3b0;
  short sStack_3ae;
  short sStack_3ac;
  short sStack_3aa;
  short local_398;
  short sStack_396;
  short sStack_394;
  short sStack_392;
  short sStack_390;
  short sStack_38e;
  short sStack_38c;
  short sStack_38a;
  short local_378;
  short sStack_376;
  short sStack_374;
  short sStack_372;
  short sStack_370;
  short sStack_36e;
  short sStack_36c;
  short sStack_36a;
  short local_358;
  short sStack_356;
  short sStack_354;
  short sStack_352;
  short sStack_350;
  short sStack_34e;
  short sStack_34c;
  short sStack_34a;
  short local_338;
  short sStack_336;
  short sStack_334;
  short sStack_332;
  short sStack_330;
  short sStack_32e;
  short sStack_32c;
  short sStack_32a;
  short local_318;
  short sStack_316;
  short sStack_314;
  short sStack_312;
  short sStack_310;
  short sStack_30e;
  short sStack_30c;
  short sStack_30a;
  short local_2f8;
  short sStack_2f6;
  short sStack_2f4;
  short sStack_2f2;
  short sStack_2f0;
  short sStack_2ee;
  short sStack_2ec;
  short sStack_2ea;
  short local_2d8;
  short sStack_2d6;
  short sStack_2d4;
  short sStack_2d2;
  short sStack_2d0;
  short sStack_2ce;
  short sStack_2cc;
  short sStack_2ca;
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  short sStack_2b0;
  short sStack_2ae;
  short sStack_2ac;
  short sStack_2aa;
  
  iVar10 = stride * 2;
  iVar91 = stride * 3;
  iVar9 = -(uint)(((uint)flt_flag >> 8 & 1) != 0);
  flt_flag_local._0_2_ = (short)alpha;
  inc._0_2_ = (short)beta;
  auVar16._2_2_ = (short)inc;
  auVar16._0_2_ = (short)inc;
  auVar16._4_2_ = (short)inc;
  auVar16._6_2_ = (short)inc;
  auVar16._10_2_ = (short)inc;
  auVar16._8_2_ = (short)inc;
  auVar16._12_2_ = (short)inc;
  auVar16._14_2_ = (short)inc;
  uVar1 = *(undefined8 *)(src + -(long)(stride << 2));
  uVar2 = *(undefined8 *)(src + -(long)iVar91);
  uVar3 = *(undefined8 *)(src + -(long)iVar10);
  uVar4 = *(undefined8 *)(src + -(long)stride);
  uVar5 = *(undefined8 *)src;
  uVar6 = *(undefined8 *)(src + stride);
  uVar7 = *(undefined8 *)(src + iVar10);
  uVar8 = *(undefined8 *)(src + iVar91);
  bStack_1997 = (byte)((ulong)uVar1 >> 8);
  bStack_1996 = (byte)((ulong)uVar1 >> 0x10);
  bStack_1995 = (byte)((ulong)uVar1 >> 0x18);
  bStack_1994 = (byte)((ulong)uVar1 >> 0x20);
  bStack_1993 = (byte)((ulong)uVar1 >> 0x28);
  bStack_1992 = (byte)((ulong)uVar1 >> 0x30);
  bStack_1991 = (byte)((ulong)uVar1 >> 0x38);
  TL3[0]._1_1_ = 0;
  TL3[0]._0_1_ = bStack_1994;
  local_19b8 = (byte)uVar2;
  bStack_19b7 = (byte)((ulong)uVar2 >> 8);
  bStack_19b6 = (byte)((ulong)uVar2 >> 0x10);
  bStack_19b5 = (byte)((ulong)uVar2 >> 0x18);
  bStack_19b4 = (byte)((ulong)uVar2 >> 0x20);
  bStack_19b3 = (byte)((ulong)uVar2 >> 0x28);
  bStack_19b2 = (byte)((ulong)uVar2 >> 0x30);
  bStack_19b1 = (byte)((ulong)uVar2 >> 0x38);
  TL3[1]._1_1_ = 0;
  TL3[1]._0_1_ = local_19b8;
  TL3[1] = CONCAT17(0,CONCAT16(bStack_19b5,
                               CONCAT15(0,CONCAT14(bStack_19b6,
                                                   CONCAT13(0,CONCAT12(bStack_19b7,(ushort)TL3[1])))
                                       )));
  lVar102 = TL3[1];
  TL2[0]._0_1_ = bStack_19b4;
  TL2[0]._1_1_ = 0;
  TL2[0]._2_1_ = bStack_19b3;
  TL2[0]._3_1_ = 0;
  TL2[0]._4_1_ = bStack_19b2;
  TL2[0]._5_1_ = 0;
  TL2[0]._6_1_ = bStack_19b1;
  local_19d8 = (byte)uVar3;
  bStack_19d7 = (byte)((ulong)uVar3 >> 8);
  bStack_19d6 = (byte)((ulong)uVar3 >> 0x10);
  bStack_19d5 = (byte)((ulong)uVar3 >> 0x18);
  bStack_19d4 = (byte)((ulong)uVar3 >> 0x20);
  bStack_19d3 = (byte)((ulong)uVar3 >> 0x28);
  bStack_19d2 = (byte)((ulong)uVar3 >> 0x30);
  bStack_19d1 = (byte)((ulong)uVar3 >> 0x38);
  TL2[1]._1_1_ = 0;
  TL2[1]._0_1_ = local_19d8;
  TL2[1] = CONCAT17(0,CONCAT16(bStack_19d5,
                               CONCAT15(0,CONCAT14(bStack_19d6,
                                                   CONCAT13(0,CONCAT12(bStack_19d7,(ushort)TL2[1])))
                                       )));
  lVar103 = TL2[1];
  TL1[0]._0_1_ = bStack_19d4;
  TL1[0]._1_1_ = 0;
  TL1[0]._2_1_ = bStack_19d3;
  TL1[0]._3_1_ = 0;
  TL1[0]._4_1_ = bStack_19d2;
  TL1[0]._5_1_ = 0;
  TL1[0]._6_1_ = bStack_19d1;
  local_19f8 = (byte)uVar4;
  bStack_19f7 = (byte)((ulong)uVar4 >> 8);
  bStack_19f6 = (byte)((ulong)uVar4 >> 0x10);
  bStack_19f5 = (byte)((ulong)uVar4 >> 0x18);
  bStack_19f4 = (byte)((ulong)uVar4 >> 0x20);
  bStack_19f3 = (byte)((ulong)uVar4 >> 0x28);
  bStack_19f2 = (byte)((ulong)uVar4 >> 0x30);
  bStack_19f1 = (byte)((ulong)uVar4 >> 0x38);
  TL1[1]._1_1_ = 0;
  TL1[1]._0_1_ = local_19f8;
  TL1[1] = CONCAT17(0,CONCAT16(bStack_19f5,
                               CONCAT15(0,CONCAT14(bStack_19f6,
                                                   CONCAT13(0,CONCAT12(bStack_19f7,(ushort)TL1[1])))
                                       )));
  lVar104 = TL1[1];
  TL0[0]._0_1_ = bStack_19f4;
  TL0[0]._1_1_ = 0;
  TL0[0]._2_1_ = bStack_19f3;
  TL0[0]._3_1_ = 0;
  TL0[0]._4_1_ = bStack_19f2;
  TL0[0]._5_1_ = 0;
  TL0[0]._6_1_ = bStack_19f1;
  local_1a18 = (byte)uVar5;
  bStack_1a17 = (byte)((ulong)uVar5 >> 8);
  bStack_1a16 = (byte)((ulong)uVar5 >> 0x10);
  bStack_1a15 = (byte)((ulong)uVar5 >> 0x18);
  bStack_1a14 = (byte)((ulong)uVar5 >> 0x20);
  bStack_1a13 = (byte)((ulong)uVar5 >> 0x28);
  bStack_1a12 = (byte)((ulong)uVar5 >> 0x30);
  bStack_1a11 = (byte)((ulong)uVar5 >> 0x38);
  TR1[1]._1_1_ = 0;
  TR1[1]._0_1_ = local_1a18;
  TR1[1] = CONCAT17(0,CONCAT16(bStack_1a15,
                               CONCAT15(0,CONCAT14(bStack_1a16,
                                                   CONCAT13(0,CONCAT12(bStack_1a17,(ushort)TR1[1])))
                                       )));
  lVar101 = TR1[1];
  TR0[0]._0_1_ = bStack_1a14;
  TR0[0]._1_1_ = 0;
  TR0[0]._2_1_ = bStack_1a13;
  TR0[0]._3_1_ = 0;
  TR0[0]._4_1_ = bStack_1a12;
  TR0[0]._5_1_ = 0;
  TR0[0]._6_1_ = bStack_1a11;
  local_1a38 = (byte)uVar6;
  bStack_1a37 = (byte)((ulong)uVar6 >> 8);
  bStack_1a36 = (byte)((ulong)uVar6 >> 0x10);
  bStack_1a35 = (byte)((ulong)uVar6 >> 0x18);
  bStack_1a34 = (byte)((ulong)uVar6 >> 0x20);
  bStack_1a33 = (byte)((ulong)uVar6 >> 0x28);
  bStack_1a32 = (byte)((ulong)uVar6 >> 0x30);
  bStack_1a31 = (byte)((ulong)uVar6 >> 0x38);
  TR2[1]._1_1_ = 0;
  TR2[1]._0_1_ = local_1a38;
  TR2[1] = CONCAT17(0,CONCAT16(bStack_1a35,
                               CONCAT15(0,CONCAT14(bStack_1a36,
                                                   CONCAT13(0,CONCAT12(bStack_1a37,(ushort)TR2[1])))
                                       )));
  lVar100 = TR2[1];
  TR1[0]._0_1_ = bStack_1a34;
  TR1[0]._1_1_ = 0;
  TR1[0]._2_1_ = bStack_1a33;
  TR1[0]._3_1_ = 0;
  TR1[0]._4_1_ = bStack_1a32;
  TR1[0]._5_1_ = 0;
  TR1[0]._6_1_ = bStack_1a31;
  local_1a58 = (byte)uVar7;
  bStack_1a57 = (byte)((ulong)uVar7 >> 8);
  bStack_1a56 = (byte)((ulong)uVar7 >> 0x10);
  bStack_1a55 = (byte)((ulong)uVar7 >> 0x18);
  bStack_1a54 = (byte)((ulong)uVar7 >> 0x20);
  bStack_1a53 = (byte)((ulong)uVar7 >> 0x28);
  bStack_1a52 = (byte)((ulong)uVar7 >> 0x30);
  bStack_1a51 = (byte)((ulong)uVar7 >> 0x38);
  TR3[1]._1_1_ = 0;
  TR3[1]._0_1_ = local_1a58;
  TR3[1] = CONCAT17(0,CONCAT16(bStack_1a55,
                               CONCAT15(0,CONCAT14(bStack_1a56,
                                                   CONCAT13(0,CONCAT12(bStack_1a57,(ushort)TR3[1])))
                                       )));
  lVar99 = TR3[1];
  TR2[0]._0_1_ = bStack_1a54;
  TR2[0]._1_1_ = 0;
  TR2[0]._2_1_ = bStack_1a53;
  TR2[0]._3_1_ = 0;
  TR2[0]._4_1_ = bStack_1a52;
  TR2[0]._5_1_ = 0;
  TR2[0]._6_1_ = bStack_1a51;
  bStack_1a77 = (byte)((ulong)uVar8 >> 8);
  bStack_1a76 = (byte)((ulong)uVar8 >> 0x10);
  bStack_1a75 = (byte)((ulong)uVar8 >> 0x18);
  bStack_1a74 = (byte)((ulong)uVar8 >> 0x20);
  bStack_1a73 = (byte)((ulong)uVar8 >> 0x28);
  bStack_1a72 = (byte)((ulong)uVar8 >> 0x30);
  bStack_1a71 = (byte)((ulong)uVar8 >> 0x38);
  TR3[0]._1_1_ = 0;
  TR3[0]._0_1_ = bStack_1a74;
  uVar92 = (undefined7)TL2[2];
  uVar93 = (undefined7)TL1[2];
  auVar15._8_7_ = uVar92;
  auVar15._0_8_ = lVar103;
  auVar15[0xf] = 0;
  auVar14._8_7_ = uVar93;
  auVar14._0_8_ = lVar104;
  auVar14[0xf] = 0;
  auVar108 = psubsw(auVar15,auVar14);
  auVar108 = pabsw(auVar108,auVar108);
  uVar94 = (undefined7)TR2[2];
  uVar95 = (undefined7)TR1[2];
  auVar13._8_7_ = uVar94;
  auVar13._0_8_ = lVar100;
  auVar13[0xf] = 0;
  auVar12._8_7_ = uVar95;
  auVar12._0_8_ = lVar101;
  auVar12[0xf] = 0;
  auVar109 = psubsw(auVar13,auVar12);
  auVar109 = pabsw(auVar109,auVar109);
  local_16a8 = auVar108._0_2_;
  sStack_16a6 = auVar108._2_2_;
  sStack_16a4 = auVar108._4_2_;
  sStack_16a2 = auVar108._6_2_;
  sStack_16a0 = auVar108._8_2_;
  sStack_169e = auVar108._10_2_;
  sStack_169c = auVar108._12_2_;
  sStack_169a = auVar108._14_2_;
  uVar106 = CONCAT26(-(ushort)(sStack_16a2 < (short)inc),
                     CONCAT24(-(ushort)(sStack_16a4 < (short)inc),
                              CONCAT22(-(ushort)(sStack_16a6 < (short)inc),
                                       -(ushort)(local_16a8 < (short)inc)))) & 0x2000200020002;
  uVar115 = CONCAT26(-(ushort)(sStack_169a < (short)inc),
                     CONCAT24(-(ushort)(sStack_169c < (short)inc),
                              CONCAT22(-(ushort)(sStack_169e < (short)inc),
                                       -(ushort)(sStack_16a0 < (short)inc)))) & 0x2000200020002;
  local_16c8 = auVar109._0_2_;
  sStack_16c6 = auVar109._2_2_;
  sStack_16c4 = auVar109._4_2_;
  sStack_16c2 = auVar109._6_2_;
  sStack_16c0 = auVar109._8_2_;
  sStack_16be = auVar109._10_2_;
  sStack_16bc = auVar109._12_2_;
  sStack_16ba = auVar109._14_2_;
  uVar107 = CONCAT26(-(ushort)(sStack_16c2 < (short)inc),
                     CONCAT24(-(ushort)(sStack_16c4 < (short)inc),
                              CONCAT22(-(ushort)(sStack_16c6 < (short)inc),
                                       -(ushort)(local_16c8 < (short)inc)))) & 0x2000200020002;
  uVar116 = CONCAT26(-(ushort)(sStack_16ba < (short)inc),
                     CONCAT24(-(ushort)(sStack_16bc < (short)inc),
                              CONCAT22(-(ushort)(sStack_16be < (short)inc),
                                       -(ushort)(sStack_16c0 < (short)inc)))) & 0x2000200020002;
  uVar96 = (undefined7)TL3[2];
  auVar11._8_7_ = uVar96;
  auVar11._0_8_ = lVar102;
  auVar11[0xf] = 0;
  auVar124._8_7_ = uVar93;
  auVar124._0_8_ = lVar104;
  auVar124[0xf] = 0;
  auVar108 = psubsw(auVar11,auVar124);
  auVar108 = pabsw(auVar108,auVar108);
  uVar97 = (undefined7)TR3[2];
  auVar123._8_7_ = uVar97;
  auVar123._0_8_ = lVar99;
  auVar123[0xf] = 0;
  auVar110._8_7_ = uVar95;
  auVar110._0_8_ = lVar101;
  auVar110[0xf] = 0;
  auVar109 = psubsw(auVar123,auVar110);
  auVar109 = pabsw(auVar109,auVar109);
  local_16e8 = auVar108._0_2_;
  sStack_16e6 = auVar108._2_2_;
  sStack_16e4 = auVar108._4_2_;
  sStack_16e2 = auVar108._6_2_;
  sStack_16e0 = auVar108._8_2_;
  sStack_16de = auVar108._10_2_;
  sStack_16dc = auVar108._12_2_;
  sStack_16da = auVar108._14_2_;
  M2[1] = CONCAT26(-(ushort)(sStack_16e2 < (short)inc),
                   CONCAT24(-(ushort)(sStack_16e4 < (short)inc),
                            CONCAT22(-(ushort)(sStack_16e6 < (short)inc),
                                     -(ushort)(local_16e8 < (short)inc))));
  M1[0] = CONCAT26(-(ushort)(sStack_16da < (short)inc),
                   CONCAT24(-(ushort)(sStack_16dc < (short)inc),
                            CONCAT22(-(ushort)(sStack_16de < (short)inc),
                                     -(ushort)(sStack_16e0 < (short)inc))));
  local_1708 = auVar109._0_2_;
  sStack_1706 = auVar109._2_2_;
  sStack_1704 = auVar109._4_2_;
  sStack_1702 = auVar109._6_2_;
  sStack_1700 = auVar109._8_2_;
  sStack_16fe = auVar109._10_2_;
  sStack_16fc = auVar109._12_2_;
  sStack_16fa = auVar109._14_2_;
  FLT_L[1] = CONCAT26(-(ushort)(sStack_1702 < (short)inc),
                      CONCAT24(-(ushort)(sStack_1704 < (short)inc),
                               CONCAT22(-(ushort)(sStack_1706 < (short)inc),
                                        -(ushort)(local_1708 < (short)inc))));
  M2[0] = CONCAT26(-(ushort)(sStack_16fa < (short)inc),
                   CONCAT24(-(ushort)(sStack_16fc < (short)inc),
                            CONCAT22(-(ushort)(sStack_16fe < (short)inc),
                                     -(ushort)(sStack_1700 < (short)inc))));
  auVar122._8_7_ = uVar93;
  auVar122._0_8_ = lVar104;
  auVar122[0xf] = 0;
  auVar121._8_7_ = uVar95;
  auVar121._0_8_ = lVar101;
  auVar121[0xf] = 0;
  auVar108 = psubsw(auVar122,auVar121);
  auVar108 = pabsw(auVar108,auVar108);
  local_1728 = auVar108._0_2_;
  sStack_1726 = auVar108._2_2_;
  sStack_1724 = auVar108._4_2_;
  sStack_1722 = auVar108._6_2_;
  sStack_1720 = auVar108._8_2_;
  sStack_171e = auVar108._10_2_;
  sStack_171c = auVar108._12_2_;
  sStack_171a = auVar108._14_2_;
  T3[1]._0_4_ = CONCAT22(-(ushort)(sStack_1726 < (short)flt_flag_local),
                         -(ushort)(local_1728 < (short)flt_flag_local));
  T3[1]._0_6_ = CONCAT24(-(ushort)(sStack_1724 < (short)flt_flag_local),(undefined4)T3[1]);
  T3[1] = CONCAT26(-(ushort)(sStack_1722 < (short)flt_flag_local),(undefined6)T3[1]);
  T2[0]._0_2_ = -(ushort)(sStack_1720 < (short)flt_flag_local);
  T2[0]._2_2_ = -(ushort)(sStack_171e < (short)flt_flag_local);
  T2[0]._4_2_ = -(ushort)(sStack_171c < (short)flt_flag_local);
  T2[0]._6_2_ = -(ushort)(sStack_171a < (short)flt_flag_local);
  auVar108 = psraw(auVar16,ZEXT416(2));
  uVar120 = M2[1] & 0x1000100010001;
  uVar125 = M1[0] & 0x1000100010001;
  local_eb8 = (short)uVar120;
  sStack_eb6 = (short)(uVar120 >> 0x10);
  sStack_eb4 = (short)(uVar120 >> 0x20);
  sStack_eb2 = (short)(uVar120 >> 0x30);
  sStack_eb0 = (short)uVar125;
  sStack_eae = (short)(uVar125 >> 0x10);
  sStack_eac = (short)(uVar125 >> 0x20);
  sStack_eaa = (short)(uVar125 >> 0x30);
  local_ec8 = (short)uVar106;
  sStack_ec6 = (short)(uVar106 >> 0x10);
  sStack_ec4 = (short)(uVar106 >> 0x20);
  sStack_ec2 = (short)(uVar106 >> 0x30);
  sStack_ec0 = (short)uVar115;
  sStack_ebe = (short)(uVar115 >> 0x10);
  sStack_ebc = (short)(uVar115 >> 0x20);
  sStack_eba = (short)(uVar115 >> 0x30);
  uVar106 = FLT_L[1] & 0x1000100010001;
  uVar115 = M2[0] & 0x1000100010001;
  local_ed8 = (short)uVar106;
  sStack_ed6 = (short)(uVar106 >> 0x10);
  sStack_ed4 = (short)(uVar106 >> 0x20);
  sStack_ed2 = (short)(uVar106 >> 0x30);
  sStack_ed0 = (short)uVar115;
  sStack_ece = (short)(uVar115 >> 0x10);
  sStack_ecc = (short)(uVar115 >> 0x20);
  sStack_eca = (short)(uVar115 >> 0x30);
  local_ee8 = (short)uVar107;
  sStack_ee6 = (short)(uVar107 >> 0x10);
  sStack_ee4 = (short)(uVar107 >> 0x20);
  sStack_ee2 = (short)(uVar107 >> 0x30);
  sStack_ee0 = (short)uVar116;
  sStack_ede = (short)(uVar116 >> 0x10);
  sStack_edc = (short)(uVar116 >> 0x20);
  sStack_eda = (short)(uVar116 >> 0x30);
  sVar105 = local_eb8 + local_ec8 + local_ed8 + local_ee8;
  sVar111 = sStack_eb6 + sStack_ec6 + sStack_ed6 + sStack_ee6;
  sVar112 = sStack_eb4 + sStack_ec4 + sStack_ed4 + sStack_ee4;
  sVar113 = sStack_eb2 + sStack_ec2 + sStack_ed2 + sStack_ee2;
  sVar114 = sStack_eb0 + sStack_ec0 + sStack_ed0 + sStack_ee0;
  sVar117 = sStack_eae + sStack_ebe + sStack_ece + sStack_ede;
  sVar118 = sStack_eac + sStack_ebc + sStack_ecc + sStack_edc;
  sVar119 = sStack_eaa + sStack_eba + sStack_eca + sStack_eda;
  local_1748 = auVar108._0_2_;
  sStack_1746 = auVar108._2_2_;
  sStack_1744 = auVar108._4_2_;
  sStack_1742 = auVar108._6_2_;
  sStack_1740 = auVar108._8_2_;
  sStack_173e = auVar108._10_2_;
  sStack_173c = auVar108._12_2_;
  sStack_173a = auVar108._14_2_;
  uStack_d36 = (ushort)bStack_1a17;
  uStack_d34 = (ushort)bStack_1a16;
  uStack_d32 = (ushort)bStack_1a15;
  uStack_d30 = (ushort)bStack_1a14;
  uStack_d2e = (ushort)bStack_1a13;
  uStack_d2c = (ushort)bStack_1a12;
  uStack_d2a = (ushort)bStack_1a11;
  uStack_d46 = (ushort)bStack_1a37;
  uStack_d44 = (ushort)bStack_1a36;
  uStack_d42 = (ushort)bStack_1a35;
  uStack_d40 = (ushort)bStack_1a34;
  uStack_d3e = (ushort)bStack_1a33;
  uStack_d3c = (ushort)bStack_1a32;
  uStack_d3a = (ushort)bStack_1a31;
  uStack_d56 = (ushort)bStack_19f7;
  uStack_d54 = (ushort)bStack_19f6;
  uStack_d52 = (ushort)bStack_19f5;
  uStack_d50 = (ushort)bStack_19f4;
  uStack_d4e = (ushort)bStack_19f3;
  uStack_d4c = (ushort)bStack_19f2;
  uStack_d4a = (ushort)bStack_19f1;
  uStack_d66 = (ushort)bStack_19d7;
  uStack_d64 = (ushort)bStack_19d6;
  uStack_d62 = (ushort)bStack_19d5;
  uStack_d60 = (ushort)bStack_19d4;
  uStack_d5e = (ushort)bStack_19d3;
  uStack_d5c = (ushort)bStack_19d2;
  uStack_d5a = (ushort)bStack_19d1;
  auVar109._8_7_ = uVar92;
  auVar109._0_8_ = lVar103;
  auVar109[0xf] = 0;
  auVar108._8_7_ = uVar94;
  auVar108._0_8_ = lVar100;
  auVar108[0xf] = 0;
  auVar108 = psubsw(auVar109,auVar108);
  auVar108 = pabsw(auVar108,auVar108);
  auVar65._8_8_ = 0x3000300030003;
  auVar65._0_8_ = 0x3000300030003;
  auVar64._8_8_ = 0x4000400040004;
  auVar64._0_8_ = 0x4000400040004;
  auVar63._8_8_ =
       ~(CONCAT26(-(ushort)(sStack_173a < sStack_169a),
                  CONCAT24(-(ushort)(sStack_173c < sStack_169c),
                           CONCAT22(-(ushort)(sStack_173e < sStack_169e),
                                    -(ushort)(sStack_1740 < sStack_16a0)))) |
        CONCAT26(-(ushort)(sStack_173a < sStack_16ba),
                 CONCAT24(-(ushort)(sStack_173c < sStack_16bc),
                          CONCAT22(-(ushort)(sStack_173e < sStack_16be),
                                   -(ushort)(sStack_1740 < sStack_16c0))))) & T2[0];
  auVar63._0_8_ =
       ~(CONCAT26(-(ushort)(sStack_1742 < sStack_16a2),
                  CONCAT24(-(ushort)(sStack_1744 < sStack_16a4),
                           CONCAT22(-(ushort)(sStack_1746 < sStack_16a6),
                                    -(ushort)(local_1748 < local_16a8)))) |
        CONCAT26(-(ushort)(sStack_1742 < sStack_16c2),
                 CONCAT24(-(ushort)(sStack_1744 < sStack_16c4),
                          CONCAT22(-(ushort)(sStack_1746 < sStack_16c6),
                                   -(ushort)(local_1748 < local_16c8))))) & T3[1];
  auVar109 = pblendvb(auVar65,auVar64,auVar63);
  auVar62._8_8_ = 0x2000200020002;
  auVar62._0_8_ = 0x2000200020002;
  auVar61._8_8_ = 0x3000300030003;
  auVar61._0_8_ = 0x3000300030003;
  auVar60._8_8_ =
       CONCAT26(-(ushort)(uStack_d2a == uStack_d3a),
                CONCAT24(-(ushort)(uStack_d2c == uStack_d3c),
                         CONCAT22(-(ushort)(uStack_d2e == uStack_d3e),
                                  -(ushort)(uStack_d30 == uStack_d40)))) &
       CONCAT26(-(ushort)(uStack_d4a == uStack_d5a),
                CONCAT24(-(ushort)(uStack_d4c == uStack_d5c),
                         CONCAT22(-(ushort)(uStack_d4e == uStack_d5e),
                                  -(ushort)(uStack_d50 == uStack_d60))));
  auVar60._0_8_ =
       CONCAT26(-(ushort)(uStack_d32 == uStack_d42),
                CONCAT24(-(ushort)(uStack_d34 == uStack_d44),
                         CONCAT22(-(ushort)(uStack_d36 == uStack_d46),
                                  -(ushort)((ushort)TR1[1] == (ushort)TR2[1])))) &
       CONCAT26(-(ushort)(uStack_d52 == uStack_d62),
                CONCAT24(-(ushort)(uStack_d54 == uStack_d64),
                         CONCAT22(-(ushort)(uStack_d56 == uStack_d66),
                                  -(ushort)((ushort)TL1[1] == (ushort)TL2[1]))));
  auVar121 = pblendvb(auVar62,auVar61,auVar60);
  auVar59._8_8_ = 0x1000100010001;
  auVar59._0_8_ = 0x1000100010001;
  auVar58._8_8_ = 0x2000200020002;
  auVar58._0_8_ = 0x2000200020002;
  auVar57._2_2_ = -(ushort)((short)(sStack_eb6 + sStack_ec6) == 2);
  auVar57._0_2_ = -(ushort)((short)(local_eb8 + local_ec8) == 2);
  auVar57._4_2_ = -(ushort)((short)(sStack_eb4 + sStack_ec4) == 2);
  auVar57._6_2_ = -(ushort)((short)(sStack_eb2 + sStack_ec2) == 2);
  auVar57._8_2_ = -(ushort)((short)(sStack_eb0 + sStack_ec0) == 2);
  auVar57._10_2_ = -(ushort)((short)(sStack_eae + sStack_ebe) == 2);
  auVar57._12_2_ = -(ushort)((short)(sStack_eac + sStack_ebc) == 2);
  auVar57._14_2_ = -(ushort)((short)(sStack_eaa + sStack_eba) == 2);
  auVar122 = pblendvb(auVar59,auVar58,auVar57);
  local_1788 = auVar108._0_2_;
  sStack_1786 = auVar108._2_2_;
  sStack_1784 = auVar108._4_2_;
  sStack_1782 = auVar108._6_2_;
  sStack_1780 = auVar108._8_2_;
  sStack_177e = auVar108._10_2_;
  sStack_177c = auVar108._12_2_;
  sStack_177a = auVar108._14_2_;
  auVar56._8_8_ = 0x1000100010001;
  auVar56._0_8_ = 0x1000100010001;
  auVar55._2_2_ = -(ushort)(sStack_1786 < (short)inc);
  auVar55._0_2_ = -(ushort)(local_1788 < (short)inc);
  auVar55._4_2_ = -(ushort)(sStack_1784 < (short)inc);
  auVar55._6_2_ = -(ushort)(sStack_1782 < (short)inc);
  auVar55._8_2_ = -(ushort)(sStack_1780 < (short)inc);
  auVar55._10_2_ = -(ushort)(sStack_177e < (short)inc);
  auVar55._12_2_ = -(ushort)(sStack_177c < (short)inc);
  auVar55._14_2_ = -(ushort)(sStack_177a < (short)inc);
  auVar108 = pblendvb(ZEXT816(0),auVar56,auVar55);
  auVar54._2_2_ = -(ushort)(sVar111 == 6);
  auVar54._0_2_ = -(ushort)(sVar105 == 6);
  auVar54._4_2_ = -(ushort)(sVar112 == 6);
  auVar54._6_2_ = -(ushort)(sVar113 == 6);
  auVar54._8_2_ = -(ushort)(sVar114 == 6);
  auVar54._10_2_ = -(ushort)(sVar117 == 6);
  auVar54._12_2_ = -(ushort)(sVar118 == 6);
  auVar54._14_2_ = -(ushort)(sVar119 == 6);
  auVar109 = pblendvb(ZEXT816(0),auVar109,auVar54);
  auVar53._2_2_ = -(ushort)(sVar111 == 5);
  auVar53._0_2_ = -(ushort)(sVar105 == 5);
  auVar53._4_2_ = -(ushort)(sVar112 == 5);
  auVar53._6_2_ = -(ushort)(sVar113 == 5);
  auVar53._8_2_ = -(ushort)(sVar114 == 5);
  auVar53._10_2_ = -(ushort)(sVar117 == 5);
  auVar53._12_2_ = -(ushort)(sVar118 == 5);
  auVar53._14_2_ = -(ushort)(sVar119 == 5);
  auVar109 = pblendvb(auVar109,auVar121,auVar53);
  auVar52._2_2_ = -(ushort)(sVar111 == 4);
  auVar52._0_2_ = -(ushort)(sVar105 == 4);
  auVar52._4_2_ = -(ushort)(sVar112 == 4);
  auVar52._6_2_ = -(ushort)(sVar113 == 4);
  auVar52._8_2_ = -(ushort)(sVar114 == 4);
  auVar52._10_2_ = -(ushort)(sVar117 == 4);
  auVar52._12_2_ = -(ushort)(sVar118 == 4);
  auVar52._14_2_ = -(ushort)(sVar119 == 4);
  auVar109 = pblendvb(auVar109,auVar122,auVar52);
  auVar51._2_2_ = -(ushort)(sVar111 == 3);
  auVar51._0_2_ = -(ushort)(sVar105 == 3);
  auVar51._4_2_ = -(ushort)(sVar112 == 3);
  auVar51._6_2_ = -(ushort)(sVar113 == 3);
  auVar51._8_2_ = -(ushort)(sVar114 == 3);
  auVar51._10_2_ = -(ushort)(sVar117 == 3);
  auVar51._12_2_ = -(ushort)(sVar118 == 3);
  auVar51._14_2_ = -(ushort)(sVar119 == 3);
  auVar108 = pblendvb(auVar109,auVar108,auVar51);
  FS3[1] = auVar108._0_8_;
  FS[0] = auVar108._8_8_;
  uVar106 = FS3[1] & CONCAT44(-(flt_flag & 1U),-(flt_flag & 1U));
  uVar107 = FS[0] & CONCAT44(iVar9,iVar9);
  sVar105 = (ushort)TL1[1] + (ushort)TR1[1] + 2;
  sVar111 = uStack_d56 + uStack_d36 + 2;
  sVar112 = uStack_d54 + uStack_d34 + 2;
  sVar113 = uStack_d52 + uStack_d32 + 2;
  sVar114 = uStack_d50 + uStack_d30 + 2;
  sVar117 = uStack_d4e + uStack_d2e + 2;
  sVar118 = uStack_d4c + uStack_d2c + 2;
  sVar119 = uStack_d4a + uStack_d2a + 2;
  V2[1] = CONCAT26(sVar113,CONCAT24(sVar112,CONCAT22(sVar111,sVar105)));
  V1[0]._0_2_ = sVar114;
  V1[0]._2_2_ = sVar117;
  V1[0]._4_2_ = sVar118;
  V1[0]._6_2_ = sVar119;
  auVar88._8_7_ = uVar93;
  auVar88._0_8_ = lVar104;
  auVar88[0xf] = 0;
  auVar108 = psllw(auVar88,ZEXT416(1));
  auVar87._8_7_ = uVar95;
  auVar87._0_8_ = lVar101;
  auVar87[0xf] = 0;
  auVar109 = psllw(auVar87,ZEXT416(1));
  local_e18 = (short)uVar106;
  sStack_e16 = (short)(uVar106 >> 0x10);
  sStack_e14 = (short)(uVar106 >> 0x20);
  sStack_e12 = (short)(uVar106 >> 0x30);
  sStack_e10 = (short)uVar107;
  sStack_e0e = (short)(uVar107 >> 0x10);
  sStack_e0c = (short)(uVar107 >> 0x20);
  sStack_e0a = (short)(uVar107 >> 0x30);
  T3[1]._0_4_ = CONCAT22(-(ushort)(sStack_e16 == 1),-(ushort)(local_e18 == 1));
  T3[1]._0_6_ = CONCAT24(-(ushort)(sStack_e14 == 1),(undefined4)T3[1]);
  T3[1] = CONCAT26(-(ushort)(sStack_e12 == 1),(undefined6)T3[1]);
  T2[0]._0_2_ = -(ushort)(sStack_e10 == 1);
  T2[0]._2_2_ = -(ushort)(sStack_e0e == 1);
  T2[0]._4_2_ = -(ushort)(sStack_e0c == 1);
  T2[0]._6_2_ = -(ushort)(sStack_e0a == 1);
  local_f58 = auVar108._0_2_;
  sStack_f56 = auVar108._2_2_;
  sStack_f54 = auVar108._4_2_;
  sStack_f52 = auVar108._6_2_;
  sStack_f50 = auVar108._8_2_;
  sStack_f4e = auVar108._10_2_;
  sStack_f4c = auVar108._12_2_;
  sStack_f4a = auVar108._14_2_;
  T1[1]._0_4_ = CONCAT22((ushort)(sStack_f56 + sVar111) >> 2,(ushort)(local_f58 + sVar105) >> 2);
  T1[1]._0_6_ = CONCAT24((ushort)(sStack_f54 + sVar112) >> 2,(undefined4)T1[1]);
  T1[1] = CONCAT26((ushort)(sStack_f52 + sVar113) >> 2,(undefined6)T1[1]);
  T0[0]._0_2_ = (ushort)(sStack_f50 + sVar114) >> 2;
  T0[0]._2_2_ = (ushort)(sStack_f4e + sVar117) >> 2;
  T0[0]._4_2_ = (ushort)(sStack_f4c + sVar118) >> 2;
  T0[0]._6_2_ = (ushort)(sStack_f4a + sVar119) >> 2;
  local_f78 = auVar109._0_2_;
  sStack_f76 = auVar109._2_2_;
  sStack_f74 = auVar109._4_2_;
  sStack_f72 = auVar109._6_2_;
  sStack_f70 = auVar109._8_2_;
  sStack_f6e = auVar109._10_2_;
  sStack_f6c = auVar109._12_2_;
  sStack_f6a = auVar109._14_2_;
  T2[1]._0_4_ = CONCAT22((ushort)(sStack_f76 + sVar111) >> 2,(ushort)(local_f78 + sVar105) >> 2);
  T2[1]._0_6_ = CONCAT24((ushort)(sStack_f74 + sVar112) >> 2,(undefined4)T2[1]);
  T2[1] = CONCAT26((ushort)(sStack_f72 + sVar113) >> 2,(undefined6)T2[1]);
  T1[0]._0_2_ = (ushort)(sStack_f70 + sVar114) >> 2;
  T1[0]._2_2_ = (ushort)(sStack_f6e + sVar117) >> 2;
  T1[0]._4_2_ = (ushort)(sStack_f6c + sVar118) >> 2;
  T1[0]._6_2_ = (ushort)(sStack_f6a + sVar119) >> 2;
  auVar50._8_7_ = uVar93;
  auVar50._0_8_ = lVar104;
  auVar50[0xf] = 0;
  auVar49._8_8_ = T0[0];
  auVar49._0_8_ = T1[1];
  auVar48._8_8_ = T2[0];
  auVar48._0_8_ = T3[1];
  auVar123 = pblendvb(auVar50,auVar49,auVar48);
  auVar47._8_7_ = uVar95;
  auVar47._0_8_ = lVar101;
  auVar47[0xf] = 0;
  auVar46._8_8_ = T1[0];
  auVar46._0_8_ = T2[1];
  auVar45._8_8_ = T2[0];
  auVar45._0_8_ = T3[1];
  auVar124 = pblendvb(auVar47,auVar46,auVar45);
  auVar86._8_8_ = V1[0];
  auVar86._0_8_ = V2[1];
  auVar108 = psllw(auVar86,ZEXT416(1));
  auVar85._8_7_ = uVar92;
  auVar85._0_8_ = lVar103;
  auVar85[0xf] = 0;
  auVar109 = psllw(auVar85,ZEXT416(1));
  auVar84._8_7_ = uVar94;
  auVar84._0_8_ = lVar100;
  auVar84[0xf] = 0;
  auVar121 = psllw(auVar84,ZEXT416(1));
  local_fe8 = auVar108._0_2_;
  sStack_fe6 = auVar108._2_2_;
  sStack_fe4 = auVar108._4_2_;
  sStack_fe2 = auVar108._6_2_;
  sStack_fe0 = auVar108._8_2_;
  sStack_fde = auVar108._10_2_;
  sStack_fdc = auVar108._12_2_;
  sStack_fda = auVar108._14_2_;
  auVar83._8_7_ = uVar93;
  auVar83._0_8_ = lVar104;
  auVar83[0xf] = 0;
  auVar122 = psllw(auVar83,ZEXT416(3));
  auVar82._8_7_ = uVar95;
  auVar82._0_8_ = lVar101;
  auVar82[0xf] = 0;
  auVar110 = psllw(auVar82,ZEXT416(3));
  local_1028 = auVar109._0_2_;
  sStack_1026 = auVar109._2_2_;
  sStack_1024 = auVar109._4_2_;
  sStack_1022 = auVar109._6_2_;
  sStack_1020 = auVar109._8_2_;
  sStack_101e = auVar109._10_2_;
  sStack_101c = auVar109._12_2_;
  sStack_101a = auVar109._14_2_;
  local_1048 = auVar121._0_2_;
  sStack_1046 = auVar121._2_2_;
  sStack_1044 = auVar121._4_2_;
  sStack_1042 = auVar121._6_2_;
  sStack_1040 = auVar121._8_2_;
  sStack_103e = auVar121._10_2_;
  sStack_103c = auVar121._12_2_;
  sStack_103a = auVar121._14_2_;
  local_1058 = auVar122._0_2_;
  sStack_1056 = auVar122._2_2_;
  sStack_1054 = auVar122._4_2_;
  sStack_1052 = auVar122._6_2_;
  sStack_1050 = auVar122._8_2_;
  sStack_104e = auVar122._10_2_;
  sStack_104c = auVar122._12_2_;
  sStack_104a = auVar122._14_2_;
  local_1078 = auVar110._0_2_;
  sStack_1076 = auVar110._2_2_;
  sStack_1074 = auVar110._4_2_;
  sStack_1072 = auVar110._6_2_;
  sStack_1070 = auVar110._8_2_;
  sStack_106e = auVar110._10_2_;
  sStack_106c = auVar110._12_2_;
  sStack_106a = auVar110._14_2_;
  T3[1]._0_4_ = CONCAT22(-(ushort)(sStack_e16 == 2),-(ushort)(local_e18 == 2));
  T3[1]._0_6_ = CONCAT24(-(ushort)(sStack_e14 == 2),(undefined4)T3[1]);
  T3[1] = CONCAT26(-(ushort)(sStack_e12 == 2),(undefined6)T3[1]);
  T2[0]._0_2_ = -(ushort)(sStack_e10 == 2);
  T2[0]._2_2_ = -(ushort)(sStack_e0e == 2);
  T2[0]._4_2_ = -(ushort)(sStack_e0c == 2);
  T2[0]._6_2_ = -(ushort)(sStack_e0a == 2);
  T1[1]._0_4_ = CONCAT22((ushort)(uStack_d66 + uStack_d36 + sStack_fe6 + sStack_1026 +
                                 sStack_1056 + 4) >> 4,
                         (ushort)((ushort)TL2[1] + (ushort)TR1[1] + local_fe8 + local_1028 +
                                 local_1058 + 4) >> 4);
  T1[1]._0_6_ = CONCAT24((ushort)(uStack_d64 + uStack_d34 + sStack_fe4 + sStack_1024 +
                                 sStack_1054 + 4) >> 4,(undefined4)T1[1]);
  T1[1] = CONCAT26((ushort)(uStack_d62 + uStack_d32 + sStack_fe2 + sStack_1022 + sStack_1052 + 4) >>
                   4,(undefined6)T1[1]);
  T0[0]._0_2_ = (ushort)(uStack_d60 + uStack_d30 + sStack_fe0 + sStack_1020 + sStack_1050 + 4) >> 4;
  T0[0]._2_2_ = (ushort)(uStack_d5e + uStack_d2e + sStack_fde + sStack_101e + sStack_104e + 4) >> 4;
  T0[0]._4_2_ = (ushort)(uStack_d5c + uStack_d2c + sStack_fdc + sStack_101c + sStack_104c + 4) >> 4;
  T0[0]._6_2_ = (ushort)(uStack_d5a + uStack_d2a + sStack_fda + sStack_101a + sStack_104a + 4) >> 4;
  T2[1]._0_4_ = CONCAT22((ushort)(uStack_d46 + uStack_d56 + sStack_fe6 + sStack_1046 +
                                 sStack_1076 + 4) >> 4,
                         (ushort)((ushort)TR2[1] + (ushort)TL1[1] + local_fe8 + local_1048 +
                                 local_1078 + 4) >> 4);
  T2[1]._0_6_ = CONCAT24((ushort)(uStack_d44 + uStack_d54 + sStack_fe4 + sStack_1044 +
                                 sStack_1074 + 4) >> 4,(undefined4)T2[1]);
  T2[1] = CONCAT26((ushort)(uStack_d42 + uStack_d52 + sStack_fe2 + sStack_1042 + sStack_1072 + 4) >>
                   4,(undefined6)T2[1]);
  T1[0]._0_2_ = (ushort)(uStack_d40 + uStack_d50 + sStack_fe0 + sStack_1040 + sStack_1070 + 4) >> 4;
  T1[0]._2_2_ = (ushort)(uStack_d3e + uStack_d4e + sStack_fde + sStack_103e + sStack_106e + 4) >> 4;
  T1[0]._4_2_ = (ushort)(uStack_d3c + uStack_d4c + sStack_fdc + sStack_103c + sStack_106c + 4) >> 4;
  T1[0]._6_2_ = (ushort)(uStack_d3a + uStack_d4a + sStack_fda + sStack_103a + sStack_106a + 4) >> 4;
  auVar44._8_8_ = T0[0];
  auVar44._0_8_ = T1[1];
  auVar43._8_8_ = T2[0];
  auVar43._0_8_ = T3[1];
  auVar122 = pblendvb(auVar123,auVar44,auVar43);
  auVar42._8_8_ = T1[0];
  auVar42._0_8_ = T2[1];
  auVar41._8_8_ = T2[0];
  auVar41._0_8_ = T3[1];
  auVar110 = pblendvb(auVar124,auVar42,auVar41);
  auVar108 = psllw(auVar108,ZEXT416(1));
  auVar81._8_7_ = uVar92;
  auVar81._0_8_ = lVar103;
  auVar81[0xf] = 0;
  auVar109 = psllw(auVar81,ZEXT416(2));
  auVar80._8_7_ = uVar94;
  auVar80._0_8_ = lVar100;
  auVar80[0xf] = 0;
  auVar121 = psllw(auVar80,ZEXT416(2));
  uStack_10d6 = (ushort)bStack_19b7;
  uStack_10d4 = (ushort)bStack_19b6;
  uStack_10d2 = (ushort)bStack_19b5;
  uStack_10d0 = (ushort)bStack_19b4;
  uStack_10ce = (ushort)bStack_19b3;
  uStack_10cc = (ushort)bStack_19b2;
  uStack_10ca = (ushort)bStack_19b1;
  uStack_10f6 = (ushort)bStack_1a57;
  uStack_10f4 = (ushort)bStack_1a56;
  uStack_10f2 = (ushort)bStack_1a55;
  uStack_10f0 = (ushort)bStack_1a54;
  uStack_10ee = (ushort)bStack_1a53;
  uStack_10ec = (ushort)bStack_1a52;
  uStack_10ea = (ushort)bStack_1a51;
  local_1118 = auVar109._0_2_;
  sStack_1116 = auVar109._2_2_;
  sStack_1114 = auVar109._4_2_;
  sStack_1112 = auVar109._6_2_;
  sStack_1110 = auVar109._8_2_;
  sStack_110e = auVar109._10_2_;
  sStack_110c = auVar109._12_2_;
  sStack_110a = auVar109._14_2_;
  local_1138 = auVar121._0_2_;
  sStack_1136 = auVar121._2_2_;
  sStack_1134 = auVar121._4_2_;
  sStack_1132 = auVar121._6_2_;
  sStack_1130 = auVar121._8_2_;
  sStack_112e = auVar121._10_2_;
  sStack_112c = auVar121._12_2_;
  sStack_112a = auVar121._14_2_;
  local_1168 = auVar108._0_2_;
  sStack_1166 = auVar108._2_2_;
  sStack_1164 = auVar108._4_2_;
  sStack_1162 = auVar108._6_2_;
  sStack_1160 = auVar108._8_2_;
  sStack_115e = auVar108._10_2_;
  sStack_115c = auVar108._12_2_;
  sStack_115a = auVar108._14_2_;
  T7[1] = CONCAT26(-(ushort)(sStack_e12 == 3),
                   CONCAT24(-(ushort)(sStack_e14 == 3),
                            CONCAT22(-(ushort)(sStack_e16 == 3),-(ushort)(local_e18 == 3))));
  lVar98 = T7[1];
  T6[0]._0_2_ = -(ushort)(sStack_e10 == 3);
  T6[0]._2_2_ = -(ushort)(sStack_e0e == 3);
  T6[0]._4_2_ = -(ushort)(sStack_e0c == 3);
  T6[0]._6_2_ = -(ushort)(sStack_e0a == 3);
  T1[1]._0_4_ = CONCAT22((ushort)(sStack_1116 + sStack_f56 + uStack_10d6 + uStack_d46 + sStack_1166)
                         >> 4,(ushort)(local_1118 + local_f58 +
                                      (ushort)TL3[1] + (ushort)TR2[1] + local_1168) >> 4);
  T1[1]._0_6_ = CONCAT24((ushort)(sStack_1114 + sStack_f54 + uStack_10d4 + uStack_d44 + sStack_1164)
                         >> 4,(undefined4)T1[1]);
  T1[1] = CONCAT26((ushort)(sStack_1112 + sStack_f52 + uStack_10d2 + uStack_d42 + sStack_1162) >> 4,
                   (undefined6)T1[1]);
  T0[0]._0_2_ = (ushort)(sStack_1110 + sStack_f50 + uStack_10d0 + uStack_d40 + sStack_1160) >> 4;
  T0[0]._2_2_ = (ushort)(sStack_110e + sStack_f4e + uStack_10ce + uStack_d3e + sStack_115e) >> 4;
  T0[0]._4_2_ = (ushort)(sStack_110c + sStack_f4c + uStack_10cc + uStack_d3c + sStack_115c) >> 4;
  T0[0]._6_2_ = (ushort)(sStack_110a + sStack_f4a + uStack_10ca + uStack_d3a + sStack_115a) >> 4;
  T2[1]._0_4_ = CONCAT22((ushort)(sStack_1136 + sStack_f76 + uStack_10f6 + uStack_d66 + sStack_1166)
                         >> 4,(ushort)(local_1138 + local_f78 +
                                      (ushort)TR3[1] + (ushort)TL2[1] + local_1168) >> 4);
  T2[1]._0_6_ = CONCAT24((ushort)(sStack_1134 + sStack_f74 + uStack_10f4 + uStack_d64 + sStack_1164)
                         >> 4,(undefined4)T2[1]);
  T2[1] = CONCAT26((ushort)(sStack_1132 + sStack_f72 + uStack_10f2 + uStack_d62 + sStack_1162) >> 4,
                   (undefined6)T2[1]);
  T1[0]._0_2_ = (ushort)(sStack_1130 + sStack_f70 + uStack_10f0 + uStack_d60 + sStack_1160) >> 4;
  T1[0]._2_2_ = (ushort)(sStack_112e + sStack_f6e + uStack_10ee + uStack_d5e + sStack_115e) >> 4;
  T1[0]._4_2_ = (ushort)(sStack_112c + sStack_f6c + uStack_10ec + uStack_d5c + sStack_115c) >> 4;
  T1[0]._6_2_ = (ushort)(sStack_112a + sStack_f6a + uStack_10ea + uStack_d5a + sStack_115a) >> 4;
  auVar40._8_8_ = T0[0];
  auVar40._0_8_ = T1[1];
  auVar39._8_8_ = T6[0];
  auVar39._0_8_ = lVar98;
  auVar123 = pblendvb(auVar122,auVar40,auVar39);
  auVar38._8_8_ = T1[0];
  auVar38._0_8_ = T2[1];
  auVar37._8_8_ = T6[0];
  auVar37._0_8_ = lVar98;
  auVar124 = pblendvb(auVar110,auVar38,auVar37);
  auVar79._8_7_ = uVar96;
  auVar79._0_8_ = lVar102;
  auVar79[0xf] = 0;
  auVar109 = psllw(auVar79,ZEXT416(1));
  auVar78._8_7_ = uVar97;
  auVar78._0_8_ = lVar99;
  auVar78[0xf] = 0;
  auVar121 = psllw(auVar78,ZEXT416(1));
  auVar77._8_7_ = uVar92;
  auVar77._0_8_ = lVar103;
  auVar77[0xf] = 0;
  auVar122 = psllw(auVar77,ZEXT416(3));
  auVar76._8_7_ = uVar94;
  auVar76._0_8_ = lVar100;
  auVar76[0xf] = 0;
  auVar110 = psllw(auVar76,ZEXT416(3));
  local_1228 = auVar109._0_2_;
  sStack_1226 = auVar109._2_2_;
  sStack_1224 = auVar109._4_2_;
  sStack_1222 = auVar109._6_2_;
  sStack_1220 = auVar109._8_2_;
  sStack_121e = auVar109._10_2_;
  sStack_121c = auVar109._12_2_;
  sStack_121a = auVar109._14_2_;
  local_1248 = auVar121._0_2_;
  sStack_1246 = auVar121._2_2_;
  sStack_1244 = auVar121._4_2_;
  sStack_1242 = auVar121._6_2_;
  sStack_1240 = auVar121._8_2_;
  sStack_123e = auVar121._10_2_;
  sStack_123c = auVar121._12_2_;
  sStack_123a = auVar121._14_2_;
  auVar75._8_7_ = uVar93;
  auVar75._0_8_ = lVar104;
  auVar75[0xf] = 0;
  auVar109 = psllw(auVar75,ZEXT416(2));
  auVar74._8_7_ = uVar95;
  auVar74._0_8_ = lVar101;
  auVar74[0xf] = 0;
  auVar121 = psllw(auVar74,ZEXT416(2));
  local_1258 = auVar122._0_2_;
  sStack_1256 = auVar122._2_2_;
  sStack_1254 = auVar122._4_2_;
  sStack_1252 = auVar122._6_2_;
  sStack_1250 = auVar122._8_2_;
  sStack_124e = auVar122._10_2_;
  sStack_124c = auVar122._12_2_;
  sStack_124a = auVar122._14_2_;
  local_1278 = auVar110._0_2_;
  sStack_1276 = auVar110._2_2_;
  sStack_1274 = auVar110._4_2_;
  sStack_1272 = auVar110._6_2_;
  sStack_1270 = auVar110._8_2_;
  sStack_126e = auVar110._10_2_;
  sStack_126c = auVar110._12_2_;
  sStack_126a = auVar110._14_2_;
  local_1298 = auVar109._0_2_;
  sStack_1296 = auVar109._2_2_;
  sStack_1294 = auVar109._4_2_;
  sStack_1292 = auVar109._6_2_;
  sStack_1290 = auVar109._8_2_;
  sStack_128e = auVar109._10_2_;
  sStack_128c = auVar109._12_2_;
  sStack_128a = auVar109._14_2_;
  local_12b8 = auVar121._0_2_;
  sStack_12b6 = auVar121._2_2_;
  sStack_12b4 = auVar121._4_2_;
  sStack_12b2 = auVar121._6_2_;
  sStack_12b0 = auVar121._8_2_;
  sStack_12ae = auVar121._10_2_;
  sStack_12ac = auVar121._12_2_;
  sStack_12aa = auVar121._14_2_;
  T1[1]._0_4_ = CONCAT22((ushort)(sStack_1256 + uStack_10d6 + uStack_d36 + sStack_1226 +
                                 sStack_1296 + 8) >> 4,
                         (ushort)(local_1258 + (ushort)TL3[1] + (ushort)TR1[1] + local_1228 +
                                 local_1298 + 8) >> 4);
  T1[1]._0_6_ = CONCAT24((ushort)(sStack_1254 + uStack_10d4 + uStack_d34 + sStack_1224 +
                                 sStack_1294 + 8) >> 4,(undefined4)T1[1]);
  T1[1] = CONCAT26((ushort)(sStack_1252 + uStack_10d2 + uStack_d32 + sStack_1222 + sStack_1292 + 8)
                   >> 4,(undefined6)T1[1]);
  T0[0]._0_2_ = (ushort)(sStack_1250 + uStack_10d0 + uStack_d30 + sStack_1220 + sStack_1290 + 8) >>
                4;
  T0[0]._2_2_ = (ushort)(sStack_124e + uStack_10ce + uStack_d2e + sStack_121e + sStack_128e + 8) >>
                4;
  T0[0]._4_2_ = (ushort)(sStack_124c + uStack_10cc + uStack_d2c + sStack_121c + sStack_128c + 8) >>
                4;
  T0[0]._6_2_ = (ushort)(sStack_124a + uStack_10ca + uStack_d2a + sStack_121a + sStack_128a + 8) >>
                4;
  T2[1]._0_4_ = CONCAT22((ushort)(sStack_1276 + uStack_10f6 + uStack_d56 + sStack_1246 +
                                 sStack_12b6 + 8) >> 4,
                         (ushort)(local_1278 + (ushort)TR3[1] + (ushort)TL1[1] + local_1248 +
                                 local_12b8 + 8) >> 4);
  T2[1]._0_6_ = CONCAT24((ushort)(sStack_1274 + uStack_10f4 + uStack_d54 + sStack_1244 +
                                 sStack_12b4 + 8) >> 4,(undefined4)T2[1]);
  T2[1] = CONCAT26((ushort)(sStack_1272 + uStack_10f2 + uStack_d52 + sStack_1242 + sStack_12b2 + 8)
                   >> 4,(undefined6)T2[1]);
  T1[0]._0_2_ = (ushort)(sStack_1270 + uStack_10f0 + uStack_d50 + sStack_1240 + sStack_12b0 + 8) >>
                4;
  T1[0]._2_2_ = (ushort)(sStack_126e + uStack_10ee + uStack_d4e + sStack_123e + sStack_12ae + 8) >>
                4;
  T1[0]._4_2_ = (ushort)(sStack_126c + uStack_10ec + uStack_d4c + sStack_123c + sStack_12ac + 8) >>
                4;
  T1[0]._6_2_ = (ushort)(sStack_126a + uStack_10ea + uStack_d4a + sStack_123a + sStack_12aa + 8) >>
                4;
  auVar36._8_7_ = uVar92;
  auVar36._0_8_ = lVar103;
  auVar36[0xf] = 0;
  auVar35._8_8_ = T0[0];
  auVar35._0_8_ = T1[1];
  auVar34._8_8_ = T6[0];
  auVar34._0_8_ = lVar98;
  auVar109 = pblendvb(auVar36,auVar35,auVar34);
  auVar33._8_7_ = uVar94;
  auVar33._0_8_ = lVar100;
  auVar33[0xf] = 0;
  auVar32._8_8_ = T1[0];
  auVar32._0_8_ = T2[1];
  auVar31._8_8_ = T6[0];
  auVar31._0_8_ = lVar98;
  auVar121 = pblendvb(auVar33,auVar32,auVar31);
  FS3[1] = CONCAT26(-(ushort)(sStack_e12 == 4),
                    CONCAT24(-(ushort)(sStack_e14 == 4),
                             CONCAT22(-(ushort)(sStack_e16 == 4),-(ushort)(local_e18 == 4))));
  lVar98 = FS3[1];
  FS[0]._0_2_ = -(ushort)(sStack_e10 == 4);
  FS[0]._2_2_ = -(ushort)(sStack_e0e == 4);
  FS[0]._4_2_ = -(ushort)(sStack_e0c == 4);
  FS[0]._6_2_ = -(ushort)(sStack_e0a == 4);
  auVar90._8_8_ = FS[0];
  auVar90._0_8_ = lVar98;
  auVar89._8_8_ = 0xffffffffffffffff;
  auVar89._0_8_ = 0xffffffffffffffff;
  if ((auVar89 & auVar90) == (undefined1  [16])0x0) {
    local_378 = auVar123._0_2_;
    sStack_376 = auVar123._2_2_;
    sStack_374 = auVar123._4_2_;
    sStack_372 = auVar123._6_2_;
    sStack_370 = auVar123._8_2_;
    sStack_36e = auVar123._10_2_;
    sStack_36c = auVar123._12_2_;
    sStack_36a = auVar123._14_2_;
    *(ulong *)(src + -(long)stride) =
         CONCAT17((0 < sStack_36a) * (sStack_36a < 0x100) * auVar123[0xe] - (0xff < sStack_36a),
                  CONCAT16((0 < sStack_36c) * (sStack_36c < 0x100) * auVar123[0xc] -
                           (0xff < sStack_36c),
                           CONCAT15((0 < sStack_36e) * (sStack_36e < 0x100) * auVar123[10] -
                                    (0xff < sStack_36e),
                                    CONCAT14((0 < sStack_370) * (sStack_370 < 0x100) * auVar123[8] -
                                             (0xff < sStack_370),
                                             CONCAT13((0 < sStack_372) * (sStack_372 < 0x100) *
                                                      auVar123[6] - (0xff < sStack_372),
                                                      CONCAT12((0 < sStack_374) *
                                                               (sStack_374 < 0x100) * auVar123[4] -
                                                               (0xff < sStack_374),
                                                               CONCAT11((0 < sStack_376) *
                                                                        (sStack_376 < 0x100) *
                                                                        auVar123[2] -
                                                                        (0xff < sStack_376),
                                                                        (0 < local_378) *
                                                                        (local_378 < 0x100) *
                                                                        auVar123[0] -
                                                                        (0xff < local_378))))))));
    local_398 = auVar124._0_2_;
    sStack_396 = auVar124._2_2_;
    sStack_394 = auVar124._4_2_;
    sStack_392 = auVar124._6_2_;
    sStack_390 = auVar124._8_2_;
    sStack_38e = auVar124._10_2_;
    sStack_38c = auVar124._12_2_;
    sStack_38a = auVar124._14_2_;
    *(ulong *)src =
         CONCAT17((0 < sStack_38a) * (sStack_38a < 0x100) * auVar124[0xe] - (0xff < sStack_38a),
                  CONCAT16((0 < sStack_38c) * (sStack_38c < 0x100) * auVar124[0xc] -
                           (0xff < sStack_38c),
                           CONCAT15((0 < sStack_38e) * (sStack_38e < 0x100) * auVar124[10] -
                                    (0xff < sStack_38e),
                                    CONCAT14((0 < sStack_390) * (sStack_390 < 0x100) * auVar124[8] -
                                             (0xff < sStack_390),
                                             CONCAT13((0 < sStack_392) * (sStack_392 < 0x100) *
                                                      auVar124[6] - (0xff < sStack_392),
                                                      CONCAT12((0 < sStack_394) *
                                                               (sStack_394 < 0x100) * auVar124[4] -
                                                               (0xff < sStack_394),
                                                               CONCAT11((0 < sStack_396) *
                                                                        (sStack_396 < 0x100) *
                                                                        auVar124[2] -
                                                                        (0xff < sStack_396),
                                                                        (0 < local_398) *
                                                                        (local_398 < 0x100) *
                                                                        auVar124[0] -
                                                                        (0xff < local_398))))))));
    local_3b8 = auVar109._0_2_;
    sStack_3b6 = auVar109._2_2_;
    sStack_3b4 = auVar109._4_2_;
    sStack_3b2 = auVar109._6_2_;
    sStack_3b0 = auVar109._8_2_;
    sStack_3ae = auVar109._10_2_;
    sStack_3ac = auVar109._12_2_;
    sStack_3aa = auVar109._14_2_;
    *(ulong *)(src + -(long)iVar10) =
         CONCAT17((0 < sStack_3aa) * (sStack_3aa < 0x100) * auVar109[0xe] - (0xff < sStack_3aa),
                  CONCAT16((0 < sStack_3ac) * (sStack_3ac < 0x100) * auVar109[0xc] -
                           (0xff < sStack_3ac),
                           CONCAT15((0 < sStack_3ae) * (sStack_3ae < 0x100) * auVar109[10] -
                                    (0xff < sStack_3ae),
                                    CONCAT14((0 < sStack_3b0) * (sStack_3b0 < 0x100) * auVar109[8] -
                                             (0xff < sStack_3b0),
                                             CONCAT13((0 < sStack_3b2) * (sStack_3b2 < 0x100) *
                                                      auVar109[6] - (0xff < sStack_3b2),
                                                      CONCAT12((0 < sStack_3b4) *
                                                               (sStack_3b4 < 0x100) * auVar109[4] -
                                                               (0xff < sStack_3b4),
                                                               CONCAT11((0 < sStack_3b6) *
                                                                        (sStack_3b6 < 0x100) *
                                                                        auVar109[2] -
                                                                        (0xff < sStack_3b6),
                                                                        (0 < local_3b8) *
                                                                        (local_3b8 < 0x100) *
                                                                        auVar109[0] -
                                                                        (0xff < local_3b8))))))));
    local_3d8 = auVar121._0_2_;
    sStack_3d6 = auVar121._2_2_;
    sStack_3d4 = auVar121._4_2_;
    sStack_3d2 = auVar121._6_2_;
    sStack_3d0 = auVar121._8_2_;
    sStack_3ce = auVar121._10_2_;
    sStack_3cc = auVar121._12_2_;
    sStack_3ca = auVar121._14_2_;
    *(ulong *)(src + stride) =
         CONCAT17((0 < sStack_3ca) * (sStack_3ca < 0x100) * auVar121[0xe] - (0xff < sStack_3ca),
                  CONCAT16((0 < sStack_3cc) * (sStack_3cc < 0x100) * auVar121[0xc] -
                           (0xff < sStack_3cc),
                           CONCAT15((0 < sStack_3ce) * (sStack_3ce < 0x100) * auVar121[10] -
                                    (0xff < sStack_3ce),
                                    CONCAT14((0 < sStack_3d0) * (sStack_3d0 < 0x100) * auVar121[8] -
                                             (0xff < sStack_3d0),
                                             CONCAT13((0 < sStack_3d2) * (sStack_3d2 < 0x100) *
                                                      auVar121[6] - (0xff < sStack_3d2),
                                                      CONCAT12((0 < sStack_3d4) *
                                                               (sStack_3d4 < 0x100) * auVar121[4] -
                                                               (0xff < sStack_3d4),
                                                               CONCAT11((0 < sStack_3d6) *
                                                                        (sStack_3d6 < 0x100) *
                                                                        auVar121[2] -
                                                                        (0xff < sStack_3d6),
                                                                        (0 < local_3d8) *
                                                                        (local_3d8 < 0x100) *
                                                                        auVar121[0] -
                                                                        (0xff < local_3d8))))))));
  }
  else {
    auVar108 = psllw(auVar108,ZEXT416(1));
    auVar73._8_7_ = uVar92;
    auVar73._0_8_ = lVar103;
    auVar73[0xf] = 0;
    auVar122 = psllw(auVar73,ZEXT416(3));
    auVar72._8_7_ = uVar94;
    auVar72._0_8_ = lVar100;
    auVar72[0xf] = 0;
    auVar110 = psllw(auVar72,ZEXT416(3));
    T3[1]._0_4_ = CONCAT22(uStack_10d6 + uStack_d46,(ushort)TL3[1] + (ushort)TR2[1]);
    T3[1]._0_6_ = CONCAT24(uStack_10d4 + uStack_d44,(undefined4)T3[1]);
    T3[1] = CONCAT26(uStack_10d2 + uStack_d42,(undefined6)T3[1]);
    T2[0]._0_2_ = uStack_10d0 + uStack_d40;
    T2[0]._2_2_ = uStack_10ce + uStack_d3e;
    T2[0]._4_2_ = uStack_10cc + uStack_d3c;
    T2[0]._6_2_ = uStack_10ca + uStack_d3a;
    T4[1]._0_4_ = CONCAT22(uStack_10f6 + uStack_d66,(ushort)TR3[1] + (ushort)TL2[1]);
    T4[1]._0_6_ = CONCAT24(uStack_10f4 + uStack_d64,(undefined4)T4[1]);
    T4[1] = CONCAT26(uStack_10f2 + uStack_d62,(undefined6)T4[1]);
    T3[0]._0_2_ = uStack_10f0 + uStack_d60;
    T3[0]._2_2_ = uStack_10ee + uStack_d5e;
    T3[0]._4_2_ = uStack_10ec + uStack_d5c;
    T3[0]._6_2_ = uStack_10ea + uStack_d5a;
    local_1358 = auVar122._0_2_;
    sStack_1356 = auVar122._2_2_;
    sStack_1354 = auVar122._4_2_;
    sStack_1352 = auVar122._6_2_;
    sStack_1350 = auVar122._8_2_;
    sStack_134e = auVar122._10_2_;
    sStack_134c = auVar122._12_2_;
    sStack_134a = auVar122._14_2_;
    local_1378 = auVar110._0_2_;
    sStack_1376 = auVar110._2_2_;
    sStack_1374 = auVar110._4_2_;
    sStack_1372 = auVar110._6_2_;
    sStack_1370 = auVar110._8_2_;
    sStack_136e = auVar110._10_2_;
    sStack_136c = auVar110._12_2_;
    sStack_136a = auVar110._14_2_;
    auVar71._8_8_ = T2[0];
    auVar71._0_8_ = T3[1];
    auVar122 = psllw(auVar71,ZEXT416(1));
    auVar70._8_8_ = T3[0];
    auVar70._0_8_ = T4[1];
    auVar110 = psllw(auVar70,ZEXT416(1));
    local_13a8 = auVar108._0_2_;
    sStack_13a6 = auVar108._2_2_;
    sStack_13a4 = auVar108._4_2_;
    sStack_13a2 = auVar108._6_2_;
    sStack_13a0 = auVar108._8_2_;
    sStack_139e = auVar108._10_2_;
    sStack_139c = auVar108._12_2_;
    sStack_139a = auVar108._14_2_;
    local_13e8 = auVar122._0_2_;
    sStack_13e6 = auVar122._2_2_;
    sStack_13e4 = auVar122._4_2_;
    sStack_13e2 = auVar122._6_2_;
    sStack_13e0 = auVar122._8_2_;
    sStack_13de = auVar122._10_2_;
    sStack_13dc = auVar122._12_2_;
    sStack_13da = auVar122._14_2_;
    local_1408 = auVar110._0_2_;
    sStack_1406 = auVar110._2_2_;
    sStack_1404 = auVar110._4_2_;
    sStack_1402 = auVar110._6_2_;
    sStack_1400 = auVar110._8_2_;
    sStack_13fe = auVar110._10_2_;
    sStack_13fc = auVar110._12_2_;
    sStack_13fa = auVar110._14_2_;
    T1[1]._0_4_ = CONCAT22((ushort)(sStack_1356 + sStack_f56 + sStack_13a6 +
                                   uStack_10d6 + uStack_d46 + sStack_13e6) >> 5,
                           (ushort)(local_1358 + local_f58 + local_13a8 +
                                   (ushort)TL3[1] + (ushort)TR2[1] + local_13e8) >> 5);
    T1[1]._0_6_ = CONCAT24((ushort)(sStack_1354 + sStack_f54 + sStack_13a4 +
                                   uStack_10d4 + uStack_d44 + sStack_13e4) >> 5,(undefined4)T1[1]);
    T1[1] = CONCAT26((ushort)(sStack_1352 + sStack_f52 + sStack_13a2 +
                             uStack_10d2 + uStack_d42 + sStack_13e2) >> 5,(undefined6)T1[1]);
    T0[0]._0_2_ = (ushort)(sStack_1350 + sStack_f50 + sStack_13a0 +
                          uStack_10d0 + uStack_d40 + sStack_13e0) >> 5;
    T0[0]._2_2_ = (ushort)(sStack_134e + sStack_f4e + sStack_139e +
                          uStack_10ce + uStack_d3e + sStack_13de) >> 5;
    T0[0]._4_2_ = (ushort)(sStack_134c + sStack_f4c + sStack_139c +
                          uStack_10cc + uStack_d3c + sStack_13dc) >> 5;
    T0[0]._6_2_ = (ushort)(sStack_134a + sStack_f4a + sStack_139a +
                          uStack_10ca + uStack_d3a + sStack_13da) >> 5;
    T2[1]._0_4_ = CONCAT22((ushort)(sStack_1376 + sStack_f76 + sStack_13a6 +
                                   uStack_10f6 + uStack_d66 + sStack_1406) >> 5,
                           (ushort)(local_1378 + local_f78 + local_13a8 +
                                   (ushort)TR3[1] + (ushort)TL2[1] + local_1408) >> 5);
    T2[1]._0_6_ = CONCAT24((ushort)(sStack_1374 + sStack_f74 + sStack_13a4 +
                                   uStack_10f4 + uStack_d64 + sStack_1404) >> 5,(undefined4)T2[1]);
    T2[1] = CONCAT26((ushort)(sStack_1372 + sStack_f72 + sStack_13a2 +
                             uStack_10f2 + uStack_d62 + sStack_1402) >> 5,(undefined6)T2[1]);
    T1[0]._0_2_ = (ushort)(sStack_1370 + sStack_f70 + sStack_13a0 +
                          uStack_10f0 + uStack_d60 + sStack_1400) >> 5;
    T1[0]._2_2_ = (ushort)(sStack_136e + sStack_f6e + sStack_139e +
                          uStack_10ee + uStack_d5e + sStack_13fe) >> 5;
    T1[0]._4_2_ = (ushort)(sStack_136c + sStack_f6c + sStack_139c +
                          uStack_10ec + uStack_d5c + sStack_13fc) >> 5;
    T1[0]._6_2_ = (ushort)(sStack_136a + sStack_f6a + sStack_139a +
                          uStack_10ea + uStack_d5a + sStack_13fa) >> 5;
    auVar30._8_8_ = T0[0];
    auVar30._0_8_ = T1[1];
    auVar29._8_8_ = FS[0];
    auVar29._0_8_ = lVar98;
    auVar122 = pblendvb(auVar123,auVar30,auVar29);
    auVar28._8_8_ = T1[0];
    auVar28._0_8_ = T2[1];
    auVar27._8_8_ = FS[0];
    auVar27._0_8_ = lVar98;
    auVar110 = pblendvb(auVar124,auVar28,auVar27);
    T1[1]._0_4_ = CONCAT22(uStack_10d6 + uStack_d66 + uStack_d56,
                           (ushort)TL3[1] + (ushort)TL2[1] + (ushort)TL1[1]);
    T1[1]._0_6_ = CONCAT24(uStack_10d4 + uStack_d64 + uStack_d54,(undefined4)T1[1]);
    T1[1] = CONCAT26(uStack_10d2 + uStack_d62 + uStack_d52,(undefined6)T1[1]);
    T0[0]._0_2_ = uStack_10d0 + uStack_d60 + uStack_d50;
    T0[0]._2_2_ = uStack_10ce + uStack_d5e + uStack_d4e;
    T0[0]._4_2_ = uStack_10cc + uStack_d5c + uStack_d4c;
    T0[0]._6_2_ = uStack_10ca + uStack_d5a + uStack_d4a;
    T2[1]._0_4_ = CONCAT22(uStack_10f6 + uStack_d46 + uStack_d36,
                           (ushort)TR3[1] + (ushort)TR2[1] + (ushort)TR1[1]);
    T2[1]._0_6_ = CONCAT24(uStack_10f4 + uStack_d44 + uStack_d34,(undefined4)T2[1]);
    T2[1] = CONCAT26(uStack_10f2 + uStack_d42 + uStack_d32,(undefined6)T2[1]);
    T1[0]._0_2_ = uStack_10f0 + uStack_d40 + uStack_d30;
    T1[0]._2_2_ = uStack_10ee + uStack_d3e + uStack_d2e;
    T1[0]._4_2_ = uStack_10ec + uStack_d3c + uStack_d2c;
    T1[0]._6_2_ = uStack_10ea + uStack_d3a + uStack_d2a;
    auVar69._8_8_ = T0[0];
    auVar69._0_8_ = T1[1];
    auVar108 = psllw(auVar69,ZEXT416(2));
    local_1558 = auVar108._0_2_;
    sStack_1556 = auVar108._2_2_;
    sStack_1554 = auVar108._4_2_;
    sStack_1552 = auVar108._6_2_;
    sStack_1550 = auVar108._8_2_;
    sStack_154e = auVar108._10_2_;
    sStack_154c = auVar108._12_2_;
    sStack_154a = auVar108._14_2_;
    auVar68._8_8_ = T1[0];
    auVar68._0_8_ = T2[1];
    auVar108 = psllw(auVar68,ZEXT416(2));
    local_1578 = auVar108._0_2_;
    sStack_1576 = auVar108._2_2_;
    sStack_1574 = auVar108._4_2_;
    sStack_1572 = auVar108._6_2_;
    sStack_1570 = auVar108._8_2_;
    sStack_156e = auVar108._10_2_;
    sStack_156c = auVar108._12_2_;
    sStack_156a = auVar108._14_2_;
    T1[1]._0_4_ = CONCAT22((ushort)(sStack_1556 + uStack_d36 + uStack_d66 + sStack_f76 + 8) >> 4,
                           (ushort)(local_1558 + (ushort)TR1[1] + (ushort)TL2[1] + local_f78 + 8) >>
                           4);
    T1[1]._0_6_ = CONCAT24((ushort)(sStack_1554 + uStack_d34 + uStack_d64 + sStack_f74 + 8) >> 4,
                           (undefined4)T1[1]);
    T1[1] = CONCAT26((ushort)(sStack_1552 + uStack_d32 + uStack_d62 + sStack_f72 + 8) >> 4,
                     (undefined6)T1[1]);
    T0[0]._0_2_ = (ushort)(sStack_1550 + uStack_d30 + uStack_d60 + sStack_f70 + 8) >> 4;
    T0[0]._2_2_ = (ushort)(sStack_154e + uStack_d2e + uStack_d5e + sStack_f6e + 8) >> 4;
    T0[0]._4_2_ = (ushort)(sStack_154c + uStack_d2c + uStack_d5c + sStack_f6c + 8) >> 4;
    T0[0]._6_2_ = (ushort)(sStack_154a + uStack_d2a + uStack_d5a + sStack_f6a + 8) >> 4;
    T2[1]._0_4_ = CONCAT22((ushort)(sStack_1576 + uStack_d56 + uStack_d46 + sStack_f56 + 8) >> 4,
                           (ushort)(local_1578 + (ushort)TL1[1] + (ushort)TR2[1] + local_f58 + 8) >>
                           4);
    T2[1]._0_6_ = CONCAT24((ushort)(sStack_1574 + uStack_d54 + uStack_d44 + sStack_f54 + 8) >> 4,
                           (undefined4)T2[1]);
    T2[1] = CONCAT26((ushort)(sStack_1572 + uStack_d52 + uStack_d42 + sStack_f52 + 8) >> 4,
                     (undefined6)T2[1]);
    T1[0]._0_2_ = (ushort)(sStack_1570 + uStack_d50 + uStack_d40 + sStack_f50 + 8) >> 4;
    T1[0]._2_2_ = (ushort)(sStack_156e + uStack_d4e + uStack_d3e + sStack_f4e + 8) >> 4;
    T1[0]._4_2_ = (ushort)(sStack_156c + uStack_d4c + uStack_d3c + sStack_f4c + 8) >> 4;
    T1[0]._6_2_ = (ushort)(sStack_156a + uStack_d4a + uStack_d3a + sStack_f4a + 8) >> 4;
    auVar26._8_8_ = T0[0];
    auVar26._0_8_ = T1[1];
    auVar25._8_8_ = FS[0];
    auVar25._0_8_ = lVar98;
    auVar123 = pblendvb(auVar109,auVar26,auVar25);
    auVar24._8_8_ = T1[0];
    auVar24._0_8_ = T2[1];
    auVar23._8_8_ = FS[0];
    auVar23._0_8_ = lVar98;
    auVar121 = pblendvb(auVar121,auVar24,auVar23);
    uStack_15e6 = (ushort)bStack_1997;
    uStack_15e4 = (ushort)bStack_1996;
    uStack_15e2 = (ushort)bStack_1995;
    uStack_15de = (ushort)bStack_1993;
    uStack_15dc = (ushort)bStack_1992;
    uStack_15da = (ushort)bStack_1991;
    T3[1]._0_4_ = CONCAT22(uStack_10d6 + uStack_d66 + uStack_15e6,
                           (ushort)TL3[1] + (ushort)TL2[1] + (ushort)(byte)uVar1);
    T3[1]._0_6_ = CONCAT24(uStack_10d4 + uStack_d64 + uStack_15e4,(undefined4)T3[1]);
    T3[1] = CONCAT26(uStack_10d2 + uStack_d62 + uStack_15e2,(undefined6)T3[1]);
    T2[0]._0_2_ = uStack_10d0 + uStack_d60 + (ushort)TL3[0];
    T2[0]._2_2_ = uStack_10ce + uStack_d5e + uStack_15de;
    T2[0]._4_2_ = uStack_10cc + uStack_d5c + uStack_15dc;
    T2[0]._6_2_ = uStack_10ca + uStack_d5a + uStack_15da;
    uStack_1606 = (ushort)bStack_1a77;
    uStack_1604 = (ushort)bStack_1a76;
    uStack_1602 = (ushort)bStack_1a75;
    uStack_15fe = (ushort)bStack_1a73;
    uStack_15fc = (ushort)bStack_1a72;
    uStack_15fa = (ushort)bStack_1a71;
    T4[1]._0_4_ = CONCAT22(uStack_10f6 + uStack_d46 + uStack_1606,
                           (ushort)TR3[1] + (ushort)TR2[1] + (ushort)(byte)uVar8);
    T4[1]._0_6_ = CONCAT24(uStack_10f4 + uStack_d44 + uStack_1604,(undefined4)T4[1]);
    T4[1] = CONCAT26(uStack_10f2 + uStack_d42 + uStack_1602,(undefined6)T4[1]);
    T3[0]._0_2_ = uStack_10f0 + uStack_d40 + (ushort)TR3[0];
    T3[0]._2_2_ = uStack_10ee + uStack_d3e + uStack_15fe;
    T3[0]._4_2_ = uStack_10ec + uStack_d3c + uStack_15fc;
    T3[0]._6_2_ = uStack_10ea + uStack_d3a + uStack_15fa;
    sVar105 = (ushort)TL1[1] + (ushort)TR1[1] + 4;
    sVar111 = uStack_d56 + uStack_d36 + 4;
    sVar112 = uStack_d54 + uStack_d34 + 4;
    sVar113 = uStack_d52 + uStack_d32 + 4;
    sVar114 = uStack_d50 + uStack_d30 + 4;
    sVar117 = uStack_d4e + uStack_d2e + 4;
    sVar118 = uStack_d4c + uStack_d2c + 4;
    sVar119 = uStack_d4a + uStack_d2a + 4;
    auVar67._8_8_ = T2[0];
    auVar67._0_8_ = T3[1];
    auVar108 = psllw(auVar67,ZEXT416(1));
    auVar66._8_8_ = T3[0];
    auVar66._0_8_ = T4[1];
    auVar109 = psllw(auVar66,ZEXT416(1));
    local_1638 = auVar108._0_2_;
    sStack_1636 = auVar108._2_2_;
    sStack_1634 = auVar108._4_2_;
    sStack_1632 = auVar108._6_2_;
    sStack_1630 = auVar108._8_2_;
    sStack_162e = auVar108._10_2_;
    sStack_162c = auVar108._12_2_;
    sStack_162a = auVar108._14_2_;
    local_1658 = auVar109._0_2_;
    sStack_1656 = auVar109._2_2_;
    sStack_1654 = auVar109._4_2_;
    sStack_1652 = auVar109._6_2_;
    sStack_1650 = auVar109._8_2_;
    sStack_164e = auVar109._10_2_;
    sStack_164c = auVar109._12_2_;
    sStack_164a = auVar109._14_2_;
    T1[1]._0_4_ = CONCAT22((ushort)(sStack_1636 + sVar111) >> 3,(ushort)(local_1638 + sVar105) >> 3)
    ;
    T1[1]._0_6_ = CONCAT24((ushort)(sStack_1634 + sVar112) >> 3,(undefined4)T1[1]);
    T1[1] = CONCAT26((ushort)(sStack_1632 + sVar113) >> 3,(undefined6)T1[1]);
    T0[0]._0_2_ = (ushort)(sStack_1630 + sVar114) >> 3;
    T0[0]._2_2_ = (ushort)(sStack_162e + sVar117) >> 3;
    T0[0]._4_2_ = (ushort)(sStack_162c + sVar118) >> 3;
    T0[0]._6_2_ = (ushort)(sStack_162a + sVar119) >> 3;
    T2[1]._0_4_ = CONCAT22((ushort)(sStack_1656 + sVar111) >> 3,(ushort)(local_1658 + sVar105) >> 3)
    ;
    T2[1]._0_6_ = CONCAT24((ushort)(sStack_1654 + sVar112) >> 3,(undefined4)T2[1]);
    T2[1] = CONCAT26((ushort)(sStack_1652 + sVar113) >> 3,(undefined6)T2[1]);
    T1[0]._0_2_ = (ushort)(sStack_1650 + sVar114) >> 3;
    T1[0]._2_2_ = (ushort)(sStack_164e + sVar117) >> 3;
    T1[0]._4_2_ = (ushort)(sStack_164c + sVar118) >> 3;
    T1[0]._6_2_ = (ushort)(sStack_164a + sVar119) >> 3;
    auVar22._8_7_ = uVar96;
    auVar22._0_8_ = lVar102;
    auVar22[0xf] = 0;
    auVar21._8_8_ = T0[0];
    auVar21._0_8_ = T1[1];
    auVar20._8_8_ = FS[0];
    auVar20._0_8_ = lVar98;
    auVar108 = pblendvb(auVar22,auVar21,auVar20);
    auVar19._8_7_ = uVar97;
    auVar19._0_8_ = lVar99;
    auVar19[0xf] = 0;
    auVar18._8_8_ = T1[0];
    auVar18._0_8_ = T2[1];
    auVar17._8_8_ = FS[0];
    auVar17._0_8_ = lVar98;
    auVar109 = pblendvb(auVar19,auVar18,auVar17);
    local_2b8 = auVar122._0_2_;
    sStack_2b6 = auVar122._2_2_;
    sStack_2b4 = auVar122._4_2_;
    sStack_2b2 = auVar122._6_2_;
    sStack_2b0 = auVar122._8_2_;
    sStack_2ae = auVar122._10_2_;
    sStack_2ac = auVar122._12_2_;
    sStack_2aa = auVar122._14_2_;
    *(ulong *)(src + -(long)stride) =
         CONCAT17((0 < sStack_2aa) * (sStack_2aa < 0x100) * auVar122[0xe] - (0xff < sStack_2aa),
                  CONCAT16((0 < sStack_2ac) * (sStack_2ac < 0x100) * auVar122[0xc] -
                           (0xff < sStack_2ac),
                           CONCAT15((0 < sStack_2ae) * (sStack_2ae < 0x100) * auVar122[10] -
                                    (0xff < sStack_2ae),
                                    CONCAT14((0 < sStack_2b0) * (sStack_2b0 < 0x100) * auVar122[8] -
                                             (0xff < sStack_2b0),
                                             CONCAT13((0 < sStack_2b2) * (sStack_2b2 < 0x100) *
                                                      auVar122[6] - (0xff < sStack_2b2),
                                                      CONCAT12((0 < sStack_2b4) *
                                                               (sStack_2b4 < 0x100) * auVar122[4] -
                                                               (0xff < sStack_2b4),
                                                               CONCAT11((0 < sStack_2b6) *
                                                                        (sStack_2b6 < 0x100) *
                                                                        auVar122[2] -
                                                                        (0xff < sStack_2b6),
                                                                        (0 < local_2b8) *
                                                                        (local_2b8 < 0x100) *
                                                                        auVar122[0] -
                                                                        (0xff < local_2b8))))))));
    local_2d8 = auVar110._0_2_;
    sStack_2d6 = auVar110._2_2_;
    sStack_2d4 = auVar110._4_2_;
    sStack_2d2 = auVar110._6_2_;
    sStack_2d0 = auVar110._8_2_;
    sStack_2ce = auVar110._10_2_;
    sStack_2cc = auVar110._12_2_;
    sStack_2ca = auVar110._14_2_;
    *(ulong *)src =
         CONCAT17((0 < sStack_2ca) * (sStack_2ca < 0x100) * auVar110[0xe] - (0xff < sStack_2ca),
                  CONCAT16((0 < sStack_2cc) * (sStack_2cc < 0x100) * auVar110[0xc] -
                           (0xff < sStack_2cc),
                           CONCAT15((0 < sStack_2ce) * (sStack_2ce < 0x100) * auVar110[10] -
                                    (0xff < sStack_2ce),
                                    CONCAT14((0 < sStack_2d0) * (sStack_2d0 < 0x100) * auVar110[8] -
                                             (0xff < sStack_2d0),
                                             CONCAT13((0 < sStack_2d2) * (sStack_2d2 < 0x100) *
                                                      auVar110[6] - (0xff < sStack_2d2),
                                                      CONCAT12((0 < sStack_2d4) *
                                                               (sStack_2d4 < 0x100) * auVar110[4] -
                                                               (0xff < sStack_2d4),
                                                               CONCAT11((0 < sStack_2d6) *
                                                                        (sStack_2d6 < 0x100) *
                                                                        auVar110[2] -
                                                                        (0xff < sStack_2d6),
                                                                        (0 < local_2d8) *
                                                                        (local_2d8 < 0x100) *
                                                                        auVar110[0] -
                                                                        (0xff < local_2d8))))))));
    local_2f8 = auVar123._0_2_;
    sStack_2f6 = auVar123._2_2_;
    sStack_2f4 = auVar123._4_2_;
    sStack_2f2 = auVar123._6_2_;
    sStack_2f0 = auVar123._8_2_;
    sStack_2ee = auVar123._10_2_;
    sStack_2ec = auVar123._12_2_;
    sStack_2ea = auVar123._14_2_;
    *(ulong *)(src + -(long)iVar10) =
         CONCAT17((0 < sStack_2ea) * (sStack_2ea < 0x100) * auVar123[0xe] - (0xff < sStack_2ea),
                  CONCAT16((0 < sStack_2ec) * (sStack_2ec < 0x100) * auVar123[0xc] -
                           (0xff < sStack_2ec),
                           CONCAT15((0 < sStack_2ee) * (sStack_2ee < 0x100) * auVar123[10] -
                                    (0xff < sStack_2ee),
                                    CONCAT14((0 < sStack_2f0) * (sStack_2f0 < 0x100) * auVar123[8] -
                                             (0xff < sStack_2f0),
                                             CONCAT13((0 < sStack_2f2) * (sStack_2f2 < 0x100) *
                                                      auVar123[6] - (0xff < sStack_2f2),
                                                      CONCAT12((0 < sStack_2f4) *
                                                               (sStack_2f4 < 0x100) * auVar123[4] -
                                                               (0xff < sStack_2f4),
                                                               CONCAT11((0 < sStack_2f6) *
                                                                        (sStack_2f6 < 0x100) *
                                                                        auVar123[2] -
                                                                        (0xff < sStack_2f6),
                                                                        (0 < local_2f8) *
                                                                        (local_2f8 < 0x100) *
                                                                        auVar123[0] -
                                                                        (0xff < local_2f8))))))));
    local_318 = auVar121._0_2_;
    sStack_316 = auVar121._2_2_;
    sStack_314 = auVar121._4_2_;
    sStack_312 = auVar121._6_2_;
    sStack_310 = auVar121._8_2_;
    sStack_30e = auVar121._10_2_;
    sStack_30c = auVar121._12_2_;
    sStack_30a = auVar121._14_2_;
    *(ulong *)(src + stride) =
         CONCAT17((0 < sStack_30a) * (sStack_30a < 0x100) * auVar121[0xe] - (0xff < sStack_30a),
                  CONCAT16((0 < sStack_30c) * (sStack_30c < 0x100) * auVar121[0xc] -
                           (0xff < sStack_30c),
                           CONCAT15((0 < sStack_30e) * (sStack_30e < 0x100) * auVar121[10] -
                                    (0xff < sStack_30e),
                                    CONCAT14((0 < sStack_310) * (sStack_310 < 0x100) * auVar121[8] -
                                             (0xff < sStack_310),
                                             CONCAT13((0 < sStack_312) * (sStack_312 < 0x100) *
                                                      auVar121[6] - (0xff < sStack_312),
                                                      CONCAT12((0 < sStack_314) *
                                                               (sStack_314 < 0x100) * auVar121[4] -
                                                               (0xff < sStack_314),
                                                               CONCAT11((0 < sStack_316) *
                                                                        (sStack_316 < 0x100) *
                                                                        auVar121[2] -
                                                                        (0xff < sStack_316),
                                                                        (0 < local_318) *
                                                                        (local_318 < 0x100) *
                                                                        auVar121[0] -
                                                                        (0xff < local_318))))))));
    local_338 = auVar108._0_2_;
    sStack_336 = auVar108._2_2_;
    sStack_334 = auVar108._4_2_;
    sStack_332 = auVar108._6_2_;
    sStack_330 = auVar108._8_2_;
    sStack_32e = auVar108._10_2_;
    sStack_32c = auVar108._12_2_;
    sStack_32a = auVar108._14_2_;
    *(ulong *)(src + -(long)iVar91) =
         CONCAT17((0 < sStack_32a) * (sStack_32a < 0x100) * auVar108[0xe] - (0xff < sStack_32a),
                  CONCAT16((0 < sStack_32c) * (sStack_32c < 0x100) * auVar108[0xc] -
                           (0xff < sStack_32c),
                           CONCAT15((0 < sStack_32e) * (sStack_32e < 0x100) * auVar108[10] -
                                    (0xff < sStack_32e),
                                    CONCAT14((0 < sStack_330) * (sStack_330 < 0x100) * auVar108[8] -
                                             (0xff < sStack_330),
                                             CONCAT13((0 < sStack_332) * (sStack_332 < 0x100) *
                                                      auVar108[6] - (0xff < sStack_332),
                                                      CONCAT12((0 < sStack_334) *
                                                               (sStack_334 < 0x100) * auVar108[4] -
                                                               (0xff < sStack_334),
                                                               CONCAT11((0 < sStack_336) *
                                                                        (sStack_336 < 0x100) *
                                                                        auVar108[2] -
                                                                        (0xff < sStack_336),
                                                                        (0 < local_338) *
                                                                        (local_338 < 0x100) *
                                                                        auVar108[0] -
                                                                        (0xff < local_338))))))));
    local_358 = auVar109._0_2_;
    sStack_356 = auVar109._2_2_;
    sStack_354 = auVar109._4_2_;
    sStack_352 = auVar109._6_2_;
    sStack_350 = auVar109._8_2_;
    sStack_34e = auVar109._10_2_;
    sStack_34c = auVar109._12_2_;
    sStack_34a = auVar109._14_2_;
    *(ulong *)(src + iVar10) =
         CONCAT17((0 < sStack_34a) * (sStack_34a < 0x100) * auVar109[0xe] - (0xff < sStack_34a),
                  CONCAT16((0 < sStack_34c) * (sStack_34c < 0x100) * auVar109[0xc] -
                           (0xff < sStack_34c),
                           CONCAT15((0 < sStack_34e) * (sStack_34e < 0x100) * auVar109[10] -
                                    (0xff < sStack_34e),
                                    CONCAT14((0 < sStack_350) * (sStack_350 < 0x100) * auVar109[8] -
                                             (0xff < sStack_350),
                                             CONCAT13((0 < sStack_352) * (sStack_352 < 0x100) *
                                                      auVar109[6] - (0xff < sStack_352),
                                                      CONCAT12((0 < sStack_354) *
                                                               (sStack_354 < 0x100) * auVar109[4] -
                                                               (0xff < sStack_354),
                                                               CONCAT11((0 < sStack_356) *
                                                                        (sStack_356 < 0x100) *
                                                                        auVar109[2] -
                                                                        (0xff < sStack_356),
                                                                        (0 < local_358) *
                                                                        (local_358 < 0x100) *
                                                                        auVar109[0] -
                                                                        (0xff < local_358))))))));
  }
  return;
}

Assistant:

void uavs3d_deblock_hor_luma_sse(pel *src, int stride, int alpha, int beta, int flt_flag)
{
    int inc = stride;
    int inc2 = inc << 1;
    int inc3 = inc + inc2;
    int inc4 = inc << 2;
    int flag0 = -(flt_flag & 1);
    int flag1 = -((flt_flag >> 8) & 1);

    __m128i TL0, TL1, TL2, TL3;
    __m128i TR0, TR1, TR2, TR3;
    __m128i TL0w, TL1w, TL2w, TR0w, TR1w, TR2w; //for swap
    __m128i V0, V1, V2, V3;
    __m128i T0, T1, T2, T3, T4, T5, T6, T7;
    __m128i M0, M1, M2;
    __m128i FLT_L, FLT_R, FLT, FS;
    __m128i FS3, FS4, FS5, FS6;

    __m128i ALPHA = _mm_set1_epi16((short)alpha);
    __m128i BETA = _mm_set1_epi16((short)beta);
    __m128i c_0 = _mm_set1_epi16(0);
    __m128i c_1 = _mm_set1_epi16(1);
    __m128i c_2 = _mm_set1_epi16(2);
    __m128i c_3 = _mm_set1_epi16(3);
    __m128i c_4 = _mm_set1_epi16(4);
    __m128i c_5 = _mm_set1_epi16(5);
    __m128i c_6 = _mm_set1_epi16(6);
    __m128i c_8 = _mm_set1_epi16(8);

    TL3 = _mm_loadl_epi64((__m128i*)(src - inc4));
    TL2 = _mm_loadl_epi64((__m128i*)(src - inc3));
    TL1 = _mm_loadl_epi64((__m128i*)(src - inc2));
    TL0 = _mm_loadl_epi64((__m128i*)(src - inc));
    TR0 = _mm_loadl_epi64((__m128i*)(src + 0));
    TR1 = _mm_loadl_epi64((__m128i*)(src + inc));
    TR2 = _mm_loadl_epi64((__m128i*)(src + inc2));
    TR3 = _mm_loadl_epi64((__m128i*)(src + inc3));

    TL3 = _mm_unpacklo_epi8(TL3, c_0);
    TL2 = _mm_unpacklo_epi8(TL2, c_0);
    TL1 = _mm_unpacklo_epi8(TL1, c_0);
    TL0 = _mm_unpacklo_epi8(TL0, c_0);
    TR0 = _mm_unpacklo_epi8(TR0, c_0);
    TR1 = _mm_unpacklo_epi8(TR1, c_0);
    TR2 = _mm_unpacklo_epi8(TR2, c_0);
    TR3 = _mm_unpacklo_epi8(TR3, c_0);


    M0 = _mm_set_epi32(flag1, flag1, flag0, flag0);

    T0 = _mm_subabs_epu16(TL1, TL0);
    T1 = _mm_subabs_epu16(TR1, TR0);
    FLT_L = _mm_and_si128(_mm_cmpgt_epi16(BETA, T0), c_2);
    FLT_R = _mm_and_si128(_mm_cmpgt_epi16(BETA, T1), c_2);

    T4 = _mm_subabs_epu16(TL2, TL0);
    T5 = _mm_subabs_epu16(TR2, TR0);
    M1 = _mm_cmpgt_epi16(BETA, T4);
    M2 = _mm_cmpgt_epi16(BETA, T5);

    T6 = _mm_subabs_epu16(TL0, TR0); // abs0
    T2 = _mm_cmpgt_epi16(ALPHA, T6); // abs0 < alpha
    T3 = _mm_srai_epi16(BETA, 2);    // Beta / 4 

    FLT_L = _mm_add_epi16(_mm_and_si128(M1, c_1), FLT_L);
    FLT_R = _mm_add_epi16(_mm_and_si128(M2, c_1), FLT_R);
    FLT = _mm_add_epi16(FLT_L, FLT_R);

    // !(COM_ABS(R0 - R1) <= Beta / 4 || COM_ABS(L0 - L1) <= Beta / 4)
    M1 = _mm_or_si128(_mm_cmpgt_epi16(T0, T3), _mm_cmpgt_epi16(T1, T3));
    M2 = _mm_and_si128(_mm_cmpeq_epi16(TR0, TR1), _mm_cmpeq_epi16(TL0, TL1));
    M1 = _mm_andnot_si128(M1, T2);

    T7 = _mm_subabs_epu16(TL1, TR1);
    FS6 = _mm_blendv_epi8(c_3, c_4, M1);
    FS5 = _mm_blendv_epi8(c_2, c_3, M2);
    FS4 = _mm_blendv_epi8(c_1, c_2, _mm_cmpeq_epi16(FLT_L, c_2));
    FS3 = _mm_blendv_epi8(c_0, c_1, _mm_cmpgt_epi16(BETA, T7));

    FS = _mm_blendv_epi8(c_0, FS6, _mm_cmpeq_epi16(FLT, c_6));
    FS = _mm_blendv_epi8(FS, FS5, _mm_cmpeq_epi16(FLT, c_5));
    FS = _mm_blendv_epi8(FS, FS4, _mm_cmpeq_epi16(FLT, c_4));
    FS = _mm_blendv_epi8(FS, FS3, _mm_cmpeq_epi16(FLT, c_3));

    FS = _mm_and_si128(FS, M0);

    TL0w = TL0;
    TL1w = TL1;
    TR0w = TR0;
    TR1w = TR1;

    /* fs == 1 */
    V0 = _mm_add_epi16(TL0w, TR0w);         // L0 + R0
    V1 = _mm_add_epi16(V0, c_2);            // L0 + R0 + 2
    V2 = _mm_slli_epi16(TL0w, 1);           // L0 << 1
    V3 = _mm_slli_epi16(TR0w, 1);

    T2 = _mm_cmpeq_epi16(FS, c_1);
    T0 = _mm_srli_epi16(_mm_add_epi16(V2, V1), 2);
    T1 = _mm_srli_epi16(_mm_add_epi16(V3, V1), 2);

    TL0 = _mm_blendv_epi8(TL0, T0, T2);
    TR0 = _mm_blendv_epi8(TR0, T1, T2);

    /* fs == 2 */
    V1 = _mm_slli_epi16(V1, 1);             // (L0 << 1) + (R0 << 1) + 4
    T0 = _mm_add_epi16(TL1w, TR0w);         // L1 + R0
    T1 = _mm_add_epi16(TR1w, TL0w);
    T2 = _mm_slli_epi16(TL1w, 1);           // L1 << 1
    T3 = _mm_slli_epi16(TR1w, 1);
    T0 = _mm_add_epi16(T0, V1);             // L1 + R0 + L0*2 + R0*2 + 4
    T1 = _mm_add_epi16(T1, V1);
    T4 = _mm_slli_epi16(TL0w, 3);           // L0*8
    T5 = _mm_slli_epi16(TR0w, 3);
    T0 = _mm_add_epi16(T0, T2);
    T1 = _mm_add_epi16(T1, T3);
    T4 = _mm_add_epi16(T4, c_4);
    T5 = _mm_add_epi16(T5, c_4);

    T2 = _mm_cmpeq_epi16(FS, c_2);
    T0 = _mm_add_epi16(T0, T4);
    T1 = _mm_add_epi16(T1, T5);
    T0 = _mm_srli_epi16(T0, 4);
    T1 = _mm_srli_epi16(T1, 4);

    TL0 = _mm_blendv_epi8(TL0, T0, T2);
    TR0 = _mm_blendv_epi8(TR0, T1, T2);

    /* fs == 3 */
    V1 = _mm_slli_epi16(V1, 1);             // (L0 << 2) + (R0 << 2) + 8
    T0 = _mm_slli_epi16(TL1w, 2);           // L1 << 2
    T1 = _mm_slli_epi16(TR1w, 2);
    T4 = _mm_add_epi16(TL2, TR1w);          // L2 + R1
    T5 = _mm_add_epi16(TR2, TL1w);

    T0 = _mm_add_epi16(T0, V2);             // (L1 << 2) + (L0 << 1)
    T1 = _mm_add_epi16(T1, V3);
    T4 = _mm_add_epi16(T4, V1);
    T5 = _mm_add_epi16(T5, V1);
    T0 = _mm_add_epi16(T0, T4);
    T1 = _mm_add_epi16(T1, T5);

    T6 = _mm_cmpeq_epi16(FS, c_3);
    T0 = _mm_srli_epi16(T0, 4);
    T1 = _mm_srli_epi16(T1, 4);

    TL0 = _mm_blendv_epi8(TL0, T0, T6);
    TR0 = _mm_blendv_epi8(TR0, T1, T6);

    T2 = _mm_add_epi16(TL2, TR0w);          // L2 + R0
    T3 = _mm_add_epi16(TR2, TL0w);
    T4 = _mm_slli_epi16(TL2, 1);
    T5 = _mm_slli_epi16(TR2, 1);
    T0 = _mm_slli_epi16(TL1w, 3);
    T1 = _mm_slli_epi16(TR1w, 3);
    T2 = _mm_add_epi16(T2, T4);             // L2 + R0 + L2*2
    T3 = _mm_add_epi16(T3, T5);
    T4 = _mm_slli_epi16(TL0w, 2);           // L0*4
    T5 = _mm_slli_epi16(TR0w, 2);
    T0 = _mm_add_epi16(T0, T2);
    T1 = _mm_add_epi16(T1, T3);
    T4 = _mm_add_epi16(T4, c_8);
    T5 = _mm_add_epi16(T5, c_8);
    T0 = _mm_add_epi16(T0, T4);
    T1 = _mm_add_epi16(T1, T5);

    T0 = _mm_srli_epi16(T0, 4);
    T1 = _mm_srli_epi16(T1, 4);

    TL1 = _mm_blendv_epi8(TL1, T0, T6);
    TR1 = _mm_blendv_epi8(TR1, T1, T6);

    FS = _mm_cmpeq_epi16(FS, c_4);

    if (!_mm_testz_si128(FS, _mm_set1_epi16(-1))) { /* fs == 4 */
        TL2w = TL2;
        TR2w = TR2;

        /* cal L0/R0 */
        V1 = _mm_slli_epi16(V1, 1);         // (L0 << 3) + (R0 << 3) + 16
        T0 = _mm_slli_epi16(TL1w, 3);       // L1 << 3
        T1 = _mm_slli_epi16(TR1w, 3);
        T2 = _mm_add_epi16(TL2w, TR1w);     // L2 + R1
        T3 = _mm_add_epi16(TR2w, TL1w);
        T0 = _mm_add_epi16(T0, V2);         // L0*2 + L1*8
        T1 = _mm_add_epi16(T1, V3);
        T4 = _mm_slli_epi16(T2, 1);
        T5 = _mm_slli_epi16(T3, 1);
        T0 = _mm_add_epi16(T0, V1);
        T1 = _mm_add_epi16(T1, V1);
        T2 = _mm_add_epi16(T2, T4);         // (L2 + R1) * 3
        T3 = _mm_add_epi16(T3, T5);

        T0 = _mm_add_epi16(T0, T2);
        T1 = _mm_add_epi16(T1, T3);
        T0 = _mm_srli_epi16(T0, 5);
        T1 = _mm_srli_epi16(T1, 5);

        TL0 = _mm_blendv_epi8(TL0, T0, FS);
        TR0 = _mm_blendv_epi8(TR0, T1, FS);

        /* cal L1/R1 */
        T4 = _mm_add_epi16(TL2w, TL1w);      // L2 + L1
        T5 = _mm_add_epi16(TR2w, TR1w);
        T2 = _mm_add_epi16(TR0w, TL1w);      // L1 + R0
        T3 = _mm_add_epi16(TL0w, TR1w);
        T0 = _mm_add_epi16(T4, TL0w);        // L0 + L1 + L2
        T1 = _mm_add_epi16(T5, TR0w);
        T2 = _mm_add_epi16(T2, V3);          // L1 + R0*3
        T3 = _mm_add_epi16(T3, V2);
        T0 = _mm_add_epi16(_mm_slli_epi16(T0, 2), T2);
        T1 = _mm_add_epi16(_mm_slli_epi16(T1, 2), T3);
        T0 = _mm_add_epi16(T0, c_8);
        T1 = _mm_add_epi16(T1, c_8);
        T0 = _mm_srli_epi16(T0, 4);
        T1 = _mm_srli_epi16(T1, 4);

        TL1 = _mm_blendv_epi8(TL1, T0, FS);
        TR1 = _mm_blendv_epi8(TR1, T1, FS);

        /* cal L2/R2 */
        T2 = _mm_add_epi16(T4, TL3);        // L1 + L2 + L3
        T3 = _mm_add_epi16(T5, TR3);
        T0 = _mm_add_epi16(V0, c_4);
        T2 = _mm_slli_epi16(T2, 1);
        T3 = _mm_slli_epi16(T3, 1);
        T2 = _mm_add_epi16(T2, T0);
        T3 = _mm_add_epi16(T3, T0);
        T0 = _mm_srli_epi16(T2, 3);
        T1 = _mm_srli_epi16(T3, 3);

        TL2 = _mm_blendv_epi8(TL2, T0, FS);
        TR2 = _mm_blendv_epi8(TR2, T1, FS);

        /* stroe result */
        _mm_storel_epi64((__m128i*)(src - inc), _mm_packus_epi16(TL0, c_0));
        _mm_storel_epi64((__m128i*)(src - 0), _mm_packus_epi16(TR0, c_0));

        _mm_storel_epi64((__m128i*)(src - inc2), _mm_packus_epi16(TL1, c_0));
        _mm_storel_epi64((__m128i*)(src + inc), _mm_packus_epi16(TR1, c_0));

        _mm_storel_epi64((__m128i*)(src - inc3), _mm_packus_epi16(TL2, c_0));
        _mm_storel_epi64((__m128i*)(src + inc2), _mm_packus_epi16(TR2, c_0));
    }
    else {
        /* stroe result */
        _mm_storel_epi64((__m128i*)(src - inc), _mm_packus_epi16(TL0, c_0));
        _mm_storel_epi64((__m128i*)(src - 0), _mm_packus_epi16(TR0, c_0));

        _mm_storel_epi64((__m128i*)(src - inc2), _mm_packus_epi16(TL1, c_0));
        _mm_storel_epi64((__m128i*)(src + inc), _mm_packus_epi16(TR1, c_0));
    }

}